

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O0

uint8 * google::protobuf::internal::WireFormat::InternalSerializeField
                  (FieldDescriptor *field,Message *message,uint8 *target,EpsCopyOutputStream *stream
                  )

{
  uint uVar1;
  long lVar2;
  unsigned_long uVar3;
  bool bVar4;
  CppType CVar5;
  Type TVar6;
  uint32 uVar7;
  int iVar8;
  uint8 *puVar9;
  Descriptor *pDVar10;
  int *piVar11;
  size_t sVar12;
  long *plVar13;
  uint *puVar14;
  unsigned_long *puVar15;
  uint64 uVar16;
  undefined4 extraout_var;
  reference ppMVar17;
  undefined4 extraout_var_00;
  Reflection *pRVar18;
  void *pvVar19;
  Reflection *in_RCX;
  Reflection *in_RDX;
  FieldDescriptor *in_RDI;
  string *value_15;
  string scratch_1;
  string *value_14;
  string scratch;
  bool strict_utf8_check;
  EnumValueDescriptor *value_13;
  bool value_12;
  double value_11;
  float value_10;
  int64 value_9;
  int32 value_8;
  uint64 value_7;
  uint32 value_6;
  uint64 value_5;
  uint32 value_4;
  int64 value_3;
  int32 value_2;
  int64 value_1;
  int32 value;
  int j;
  RepeatedField<bool> r_13;
  RepeatedField<double> r_12;
  RepeatedField<float> r_11;
  RepeatedField<long> r_10;
  RepeatedField<int> r_9;
  RepeatedField<unsigned_long> r_8;
  RepeatedField<unsigned_int> r_7;
  RepeatedField<int> r_6;
  RepeatedField<unsigned_long> r_5;
  RepeatedField<unsigned_int> r_4;
  RepeatedField<long> r_3;
  RepeatedField<int> r_2;
  RepeatedField<long> r_1;
  RepeatedField<int> r;
  vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  map_entries;
  int count;
  MapIterator it_1;
  MapValueRef map_value;
  iterator it;
  vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_> sorted_key_list;
  MapFieldBase *map_field;
  Reflection *message_reflection;
  ptrdiff_t size_8;
  ptrdiff_t size_7;
  unsigned_long size;
  unsigned_long element_size;
  unsigned_long size_1;
  unsigned_long element_size_1;
  unsigned_long size_2;
  unsigned_long element_size_2;
  unsigned_long size_3;
  unsigned_long element_size_3;
  unsigned_long size_4;
  unsigned_long element_size_4;
  unsigned_long size_5;
  unsigned_long element_size_5;
  unsigned_long size_6;
  unsigned_long element_size_6;
  int *end_6;
  int *it_8;
  int *end;
  int *it_2;
  long *end_1;
  long *it_3;
  int *end_2;
  int *it_4;
  long *end_3;
  long *it_5;
  uint *end_4;
  uint *it_6;
  unsigned_long *end_5;
  unsigned_long *it_7;
  Operation in_stack_ffffffffffffe5a8;
  int in_stack_ffffffffffffe5ac;
  Reflection *in_stack_ffffffffffffe5b0;
  Reflection *in_stack_ffffffffffffe5b8;
  Reflection *in_stack_ffffffffffffe5c0;
  Reflection *in_stack_ffffffffffffe5c8;
  Reflection *in_stack_ffffffffffffe5d0;
  undefined7 in_stack_ffffffffffffe5d8;
  undefined1 in_stack_ffffffffffffe5df;
  FieldDescriptor *in_stack_ffffffffffffe5e0;
  undefined4 in_stack_ffffffffffffe5e8;
  undefined4 in_stack_ffffffffffffe5ec;
  string *local_1a08;
  MapValueRef *in_stack_ffffffffffffe610;
  MapKey *in_stack_ffffffffffffe618;
  FieldDescriptor *in_stack_ffffffffffffe620;
  Reflection *in_stack_ffffffffffffe628;
  Reflection *in_stack_ffffffffffffe630;
  undefined4 in_stack_ffffffffffffe658;
  undefined4 in_stack_ffffffffffffe65c;
  Reflection *in_stack_ffffffffffffe660;
  Message *in_stack_ffffffffffffe668;
  string *local_1978;
  undefined4 in_stack_ffffffffffffe6b0;
  undefined4 in_stack_ffffffffffffe6b4;
  Reflection *in_stack_ffffffffffffe6b8;
  undefined8 in_stack_ffffffffffffe6c0;
  Message *in_stack_ffffffffffffe6c8;
  Message *local_1900;
  Message *local_18f8;
  Message *in_stack_ffffffffffffe730;
  FieldDescriptor *in_stack_ffffffffffffe738;
  Message *local_18c0;
  Message *local_18b8;
  bool local_188b;
  double local_1868;
  float local_1834;
  uint64 local_1808;
  uint32 local_17d4;
  uint64 local_17a8;
  uint32 local_1774;
  uint64 local_1748;
  uint32 local_1714;
  int64 local_16e8;
  int32 local_16b4;
  uint64 local_1688;
  int32 local_1654;
  string local_1180 [32];
  string *local_1160;
  string local_1158 [39];
  byte local_1131;
  EnumValueDescriptor *local_1130;
  bool local_1121;
  double local_1120;
  float local_1114;
  uint64 local_1110;
  uint32 local_1104;
  uint64 local_1100;
  uint32 local_10f4;
  uint64 local_10f0;
  uint32 local_10e4;
  int64 local_10e0;
  int32 local_10d4;
  uint64 local_10d0;
  int32 local_10c4;
  int local_10c0;
  RepeatedField<bool> local_1080;
  RepeatedField<double> local_1070;
  RepeatedField<float> local_1060;
  RepeatedField<long> local_1050;
  RepeatedField<int> local_1040;
  RepeatedField<unsigned_long> local_1030;
  RepeatedField<unsigned_int> local_1020;
  RepeatedField<int> local_1010;
  RepeatedField<unsigned_long> local_1000;
  RepeatedField<unsigned_int> local_ff0;
  RepeatedField<long> local_fe0;
  RepeatedField<int> local_fd0;
  RepeatedField<long> local_fc0;
  RepeatedField<int> local_fb0;
  undefined4 local_f9c;
  vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  local_f80;
  int local_f64;
  MapIterator local_f30;
  MapValueRef local_ef0;
  MapKey *local_ee0;
  __normal_iterator<google::protobuf::MapKey_*,_std::vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>_>
  local_ed8 [4];
  MapFieldBase *local_eb8;
  Reflection *local_eb0;
  Reflection *local_ea8;
  Reflection *local_ea0;
  FieldDescriptor *local_e90;
  Reflection *local_e88;
  Reflection *local_e80;
  uint64 local_e78;
  int local_e6c;
  Reflection *local_e68;
  uint32 local_e60;
  int local_e5c;
  Reflection *local_e58;
  uint64 local_e50;
  int local_e44;
  size_t local_e40;
  Reflection *local_e38;
  string *local_e30;
  int local_e24;
  Reflection *local_e18;
  size_t local_e10;
  Reflection *local_e08;
  string *local_e00;
  int local_df4;
  Reflection *local_df0;
  Reflection *local_de8;
  Reflection *local_de0;
  undefined4 local_dd8;
  int local_dd4;
  Reflection *local_dd0;
  undefined4 local_dc8;
  int local_dc4;
  Reflection *local_dc0;
  undefined4 local_db8;
  int local_db4;
  Reflection *local_db0;
  uint32 local_da4;
  Reflection *local_da0;
  uint32 local_d94;
  Reflection *local_d90;
  uint32 local_d84;
  Reflection *local_d80;
  uint local_d74;
  RepeatedField<int> *local_d70;
  int local_d64;
  Reflection *local_d60;
  Reflection *local_d58;
  uint local_d4c;
  RepeatedField<long> *local_d48;
  int local_d3c;
  Reflection *local_d38;
  Reflection *local_d30;
  uint local_d24;
  RepeatedField<int> *local_d20;
  int local_d14;
  Reflection *local_d10;
  Reflection *local_d08;
  uint local_cfc;
  RepeatedField<long> *local_cf8;
  int local_cec;
  Reflection *local_ce8;
  Reflection *local_ce0;
  uint local_cd4;
  RepeatedField<unsigned_int> *local_cd0;
  int local_cc4;
  Reflection *local_cc0;
  Reflection *local_cb8;
  uint local_cac;
  RepeatedField<unsigned_long> *local_ca8;
  int local_c9c;
  Reflection *local_c98;
  Reflection *local_c90;
  uint local_c84;
  RepeatedField<int> *local_c80;
  int local_c74;
  Reflection *local_c70;
  long local_c68;
  undefined8 local_c60;
  Reflection *local_c58;
  RepeatedField<unsigned_int> *local_c50;
  int local_c44;
  Reflection *local_c40;
  long local_c38;
  undefined8 local_c30;
  Reflection *local_c28;
  RepeatedField<unsigned_long> *local_c20;
  int local_c14;
  Reflection *local_c10;
  long local_c08;
  undefined8 local_c00;
  Reflection *local_bf8;
  RepeatedField<int> *local_bf0;
  int local_be4;
  Reflection *local_be0;
  long local_bd8;
  undefined8 local_bd0;
  Reflection *local_bc8;
  RepeatedField<long> *local_bc0;
  int local_bb4;
  Reflection *local_bb0;
  long local_ba8;
  undefined8 local_ba0;
  Reflection *local_b98;
  RepeatedField<float> *local_b90;
  int local_b84;
  Reflection *local_b80;
  long local_b78;
  undefined8 local_b70;
  Reflection *local_b68;
  RepeatedField<double> *local_b60;
  int local_b54;
  Reflection *local_b50;
  long local_b48;
  undefined8 local_b40;
  Reflection *local_b38;
  RepeatedField<bool> *local_b30;
  int local_b24;
  Reflection *local_b20;
  Reflection *local_b18;
  int32 local_b10;
  int local_b0c;
  Reflection *local_b08;
  undefined4 local_b00;
  int local_afc;
  Reflection *local_af8;
  uint32 local_aec;
  Reflection *local_ae8;
  uint64 local_ae0;
  int local_ad4;
  Reflection *local_ad0;
  undefined4 local_ac8;
  int local_ac4;
  Reflection *local_ac0;
  uint32 local_ab4;
  Reflection *local_ab0;
  int32 local_aa8;
  int local_aa4;
  Reflection *local_aa0;
  undefined4 local_a98;
  int local_a94;
  Reflection *local_a90;
  uint32 local_a84;
  Reflection *local_a80;
  int64 local_a78;
  int local_a6c;
  Reflection *local_a68;
  undefined4 local_a60;
  int local_a5c;
  Reflection *local_a58;
  uint32 local_a4c;
  Reflection *local_a48;
  uint32 local_a40;
  int local_a3c;
  Reflection *local_a38;
  undefined4 local_a30;
  int local_a2c;
  Reflection *local_a28;
  uint32 local_a1c;
  Reflection *local_a18;
  uint32 local_a10;
  int local_a0c;
  Reflection *local_a08;
  undefined4 local_a00;
  int local_9fc;
  Reflection *local_9f8;
  uint32 local_9ec;
  Reflection *local_9e8;
  uint64 local_9e0;
  int local_9d4;
  Reflection *local_9d0;
  undefined4 local_9c8;
  int local_9c4;
  Reflection *local_9c0;
  uint32 local_9b4;
  Reflection *local_9b0;
  float local_9a8;
  int local_9a4;
  Reflection *local_9a0;
  undefined4 local_998;
  int local_994;
  Reflection *local_990;
  uint32 local_984;
  Reflection *local_980;
  double local_978;
  int local_96c;
  Reflection *local_968;
  undefined4 local_960;
  int local_95c;
  Reflection *local_958;
  uint32 local_94c;
  Reflection *local_948;
  byte local_93d;
  int local_93c;
  Reflection *local_938;
  undefined4 local_930;
  int local_92c;
  Reflection *local_928;
  uint32 local_91c;
  Reflection *local_918;
  Reflection *local_910;
  Message *local_908;
  int local_8fc;
  uint8 *local_8f8;
  undefined4 local_8f0;
  int local_8ec;
  Reflection *local_8e8;
  undefined4 local_8e0;
  int local_8dc;
  Reflection *local_8d8;
  uint32 local_8cc;
  uint8 *local_8c8;
  uint32 local_8bc;
  Reflection *local_8b8;
  Reflection *local_8b0;
  Message *local_8a8;
  int local_89c;
  Reflection *local_898;
  undefined4 local_890;
  int local_88c;
  Reflection *local_888;
  uint32 local_87c;
  Reflection *local_878;
  int local_870;
  int local_86c;
  Reflection *local_868;
  undefined4 local_860;
  int local_85c;
  Reflection *local_858;
  uint32 local_84c;
  uint8 *local_848;
  uint64 local_840;
  uint8 *local_838;
  uint32 local_82c;
  uint8 *local_828;
  uint64 local_820;
  Reflection *local_818;
  uint local_80c;
  Reflection *local_808;
  Reflection *local_800;
  uint local_7f4;
  Reflection *local_7f0;
  uint8 *local_7e8;
  int32 local_7dc;
  uint8 *local_7d8;
  uint64 local_7d0;
  uint8 *local_7c8;
  int32 local_7bc;
  uint8 *local_7b8;
  int64 local_7b0;
  uint8 *local_7a8;
  uint32 local_79c;
  uint8 *local_798;
  uint32 local_78c;
  uint8 *local_788;
  uint64 local_780;
  uint8 *local_778;
  float local_76c;
  uint8 *local_768;
  double local_760;
  uint8 *local_758;
  byte local_749;
  uint8 *local_748;
  int local_73c;
  int *local_738;
  int *local_730;
  code *local_728;
  Reflection *local_720;
  uint local_714;
  RepeatedField<int> *local_710;
  int local_704;
  Reflection *local_700;
  Reflection *local_6f8;
  ulong local_6f0;
  Reflection *local_6e8;
  int *local_6e0;
  int *local_6d8;
  code *local_6d0;
  Reflection *local_6c8;
  uint local_6bc;
  RepeatedField<int> *local_6b8;
  int local_6ac;
  Reflection *local_6a8;
  Reflection *local_6a0;
  ulong local_698;
  Reflection *local_690;
  Reflection *local_688;
  uint local_680;
  int local_67c;
  Reflection *local_678;
  Reflection *local_670;
  uint local_668;
  int local_664;
  Reflection *local_660;
  Reflection *local_658;
  uint local_650;
  int local_64c;
  Reflection *local_648;
  Reflection *local_640;
  uint local_638;
  int local_634;
  Reflection *local_630;
  Reflection *local_628;
  uint local_620;
  int local_61c;
  Reflection *local_618;
  Reflection *local_610;
  uint local_608;
  int local_604;
  Reflection *local_600;
  Reflection *local_5f8;
  uint local_5f0;
  int local_5ec;
  Reflection *local_5e8;
  Reflection *local_5e0;
  uint local_5d8;
  int local_5d4;
  Reflection *local_5d0;
  Reflection *local_5c8;
  uint local_5c0;
  int local_5bc;
  Reflection *local_5b8;
  Reflection *local_5b0;
  undefined4 local_5a8;
  int local_5a4;
  Reflection *local_5a0;
  Reflection *local_598;
  uint local_58c;
  Reflection *local_588;
  Reflection *local_580;
  undefined4 local_578;
  int local_574;
  Reflection *local_570;
  Reflection *local_568;
  uint local_55c;
  Reflection *local_558;
  Reflection *local_550;
  undefined4 local_548;
  int local_544;
  Reflection *local_540;
  Reflection *local_538;
  uint local_52c;
  Reflection *local_528;
  Reflection *local_520;
  undefined4 local_518;
  int local_514;
  Reflection *local_510;
  Reflection *local_508;
  uint local_4fc;
  Reflection *local_4f8;
  Reflection *local_4f0;
  undefined4 local_4e8;
  int local_4e4;
  Reflection *local_4e0;
  Reflection *local_4d8;
  uint local_4cc;
  Reflection *local_4c8;
  Reflection *local_4c0;
  undefined4 local_4b8;
  int local_4b4;
  Reflection *local_4b0;
  Reflection *local_4a8;
  uint local_49c;
  Reflection *local_498;
  Reflection *local_490;
  undefined4 local_488;
  int local_484;
  Reflection *local_480;
  Reflection *local_478;
  uint local_46c;
  Reflection *local_468;
  Reflection *local_460;
  undefined4 local_458;
  int local_454;
  Reflection *local_450;
  Reflection *local_448;
  uint local_43c;
  Reflection *local_438;
  Reflection *local_430;
  undefined4 local_428;
  int local_424;
  Reflection *local_420;
  Reflection *local_418;
  uint local_40c;
  Reflection *local_408;
  Reflection *local_400;
  uint local_3f4;
  Reflection *local_3f0;
  uint local_3e4;
  Reflection *local_3e0;
  uint local_3d4;
  Reflection *local_3d0;
  uint local_3c4;
  Reflection *local_3c0;
  uint local_3b4;
  Reflection *local_3b0;
  uint local_3a4;
  Reflection *local_3a0;
  uint local_394;
  Reflection *local_390;
  uint local_384;
  Reflection *local_380;
  uint local_374;
  long *local_370;
  long *local_368;
  code *local_360;
  Reflection *local_358;
  uint local_34c;
  RepeatedField<long> *local_348;
  int local_33c;
  Reflection *local_338;
  Reflection *local_330;
  ulong local_328;
  Reflection *local_320;
  Reflection *local_318;
  uint local_310;
  int local_30c;
  Reflection *local_308;
  Reflection *local_300;
  undefined4 local_2f8;
  int local_2f4;
  Reflection *local_2f0;
  Reflection *local_2e8;
  uint local_2dc;
  Reflection *local_2d8;
  Reflection *local_2d0;
  uint local_2c4;
  int *local_2c0;
  int *local_2b8;
  code *local_2b0;
  Reflection *local_2a8;
  uint local_29c;
  RepeatedField<int> *local_298;
  int local_28c;
  Reflection *local_288;
  Reflection *local_280;
  uint local_274;
  Reflection *local_270;
  Reflection *local_268;
  uint local_260;
  int local_25c;
  Reflection *local_258;
  Reflection *local_250;
  undefined4 local_248;
  int local_244;
  Reflection *local_240;
  Reflection *local_238;
  uint local_22c;
  Reflection *local_228;
  Reflection *local_220;
  uint local_214;
  long *local_210;
  long *local_208;
  code *local_200;
  Reflection *local_1f8;
  uint local_1ec;
  RepeatedField<long> *local_1e8;
  int local_1dc;
  Reflection *local_1d8;
  Reflection *local_1d0;
  ulong local_1c8;
  Reflection *local_1c0;
  Reflection *local_1b8;
  uint local_1b0;
  int local_1ac;
  Reflection *local_1a8;
  Reflection *local_1a0;
  undefined4 local_198;
  int local_194;
  Reflection *local_190;
  Reflection *local_188;
  uint local_17c;
  Reflection *local_178;
  Reflection *local_170;
  uint local_164;
  uint *local_160;
  uint *local_158;
  code *local_150;
  Reflection *local_148;
  uint local_13c;
  RepeatedField<unsigned_int> *local_138;
  int local_12c;
  Reflection *local_128;
  Reflection *local_120;
  uint local_114;
  Reflection *local_110;
  Reflection *local_108;
  uint local_100;
  int local_fc;
  Reflection *local_f8;
  Reflection *local_f0;
  undefined4 local_e8;
  int local_e4;
  Reflection *local_e0;
  Reflection *local_d8;
  uint local_cc;
  Reflection *local_c8;
  Reflection *local_c0;
  uint local_b4;
  unsigned_long *local_b0;
  unsigned_long *local_a8;
  code *local_a0;
  Reflection *local_98;
  uint local_8c;
  RepeatedField<unsigned_long> *local_88;
  int local_7c;
  Reflection *local_78;
  Reflection *local_70;
  ulong local_68;
  Reflection *local_60;
  Reflection *local_58;
  uint local_50;
  int local_4c;
  Reflection *local_48;
  Reflection *local_40;
  undefined4 local_38;
  int local_34;
  Reflection *local_30;
  Reflection *local_28;
  uint local_1c;
  Reflection *local_18;
  Reflection *local_10;
  uint local_4;
  
  iVar8 = (int)((ulong)in_stack_ffffffffffffe6c0 >> 0x20);
  local_ea8 = in_RCX;
  local_ea0 = in_RDX;
  local_e90 = in_RDI;
  local_eb0 = Message::GetReflection((Message *)in_stack_ffffffffffffe5b0);
  bVar4 = FieldDescriptor::is_extension(local_e90);
  if (bVar4) {
    pDVar10 = FieldDescriptor::containing_type(local_e90);
    Descriptor::options(pDVar10);
    bVar4 = MessageOptions::message_set_wire_format((MessageOptions *)0x46959c);
    if (((bVar4) &&
        (CVar5 = FieldDescriptor::cpp_type((FieldDescriptor *)0x4695af), CVar5 == CPPTYPE_MESSAGE))
       && (bVar4 = FieldDescriptor::is_repeated((FieldDescriptor *)0x4695c1), !bVar4)) {
      puVar9 = InternalSerializeMessageSetItem
                         ((FieldDescriptor *)in_stack_ffffffffffffe5c0,
                          (Message *)in_stack_ffffffffffffe5b8,(uint8 *)in_stack_ffffffffffffe5b0,
                          (EpsCopyOutputStream *)
                          CONCAT44(in_stack_ffffffffffffe5ac,in_stack_ffffffffffffe5a8));
      return puVar9;
    }
  }
  bVar4 = FieldDescriptor::is_map((FieldDescriptor *)in_stack_ffffffffffffe5b0);
  if (bVar4) {
    local_eb8 = Reflection::GetMapData
                          (in_stack_ffffffffffffe5c0,(Message *)in_stack_ffffffffffffe5b8,
                           (FieldDescriptor *)in_stack_ffffffffffffe5b0);
    bVar4 = MapFieldBase::IsMapValid((MapFieldBase *)in_stack_ffffffffffffe5b0);
    if (bVar4) {
      bVar4 = io::EpsCopyOutputStream::IsSerializationDeterministic
                        ((EpsCopyOutputStream *)local_ea8);
      if (bVar4) {
        MapKeySorter::SortKey
                  (in_stack_ffffffffffffe668,in_stack_ffffffffffffe660,
                   (FieldDescriptor *)CONCAT44(in_stack_ffffffffffffe65c,in_stack_ffffffffffffe658))
        ;
        local_ed8[0]._M_current =
             (MapKey *)
             std::vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>::begin
                       ((vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
                         *)CONCAT44(in_stack_ffffffffffffe5ac,in_stack_ffffffffffffe5a8));
        while( true ) {
          local_ee0 = (MapKey *)
                      std::
                      vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>::
                      end((vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
                           *)CONCAT44(in_stack_ffffffffffffe5ac,in_stack_ffffffffffffe5a8));
          bVar4 = __gnu_cxx::operator!=
                            ((__normal_iterator<google::protobuf::MapKey_*,_std::vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>_>
                              *)in_stack_ffffffffffffe5b0,
                             (__normal_iterator<google::protobuf::MapKey_*,_std::vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>_>
                              *)CONCAT44(in_stack_ffffffffffffe5ac,in_stack_ffffffffffffe5a8));
          if (!bVar4) break;
          MapValueRef::MapValueRef(&local_ef0);
          __gnu_cxx::
          __normal_iterator<google::protobuf::MapKey_*,_std::vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>_>
          ::operator*(local_ed8);
          Reflection::InsertOrLookupMapValue
                    (in_stack_ffffffffffffe630,(Message *)in_stack_ffffffffffffe628,
                     in_stack_ffffffffffffe620,in_stack_ffffffffffffe618,in_stack_ffffffffffffe610);
          __gnu_cxx::
          __normal_iterator<google::protobuf::MapKey_*,_std::vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>_>
          ::operator*(local_ed8);
          local_ea0 = (Reflection *)
                      InternalSerializeMapEntry
                                (in_stack_ffffffffffffe5e0,
                                 (MapKey *)
                                 CONCAT17(in_stack_ffffffffffffe5df,in_stack_ffffffffffffe5d8),
                                 (MapValueRef *)in_stack_ffffffffffffe5d0,
                                 (uint8 *)in_stack_ffffffffffffe5c8,
                                 (EpsCopyOutputStream *)in_stack_ffffffffffffe5c0);
          __gnu_cxx::
          __normal_iterator<google::protobuf::MapKey_*,_std::vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>_>
          ::operator++(local_ed8);
        }
        std::vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>::~vector
                  ((vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_> *)
                   in_stack_ffffffffffffe5c0);
      }
      else {
        Reflection::MapBegin
                  ((Reflection *)CONCAT44(in_stack_ffffffffffffe5ec,in_stack_ffffffffffffe5e8),
                   (Message *)in_stack_ffffffffffffe5e0,
                   (FieldDescriptor *)CONCAT17(in_stack_ffffffffffffe5df,in_stack_ffffffffffffe5d8))
        ;
        while( true ) {
          Reflection::MapEnd((Reflection *)
                             CONCAT44(in_stack_ffffffffffffe5ec,in_stack_ffffffffffffe5e8),
                             (Message *)in_stack_ffffffffffffe5e0,
                             (FieldDescriptor *)
                             CONCAT17(in_stack_ffffffffffffe5df,in_stack_ffffffffffffe5d8));
          bVar4 = protobuf::operator!=
                            ((MapIterator *)in_stack_ffffffffffffe5b0,
                             (MapIterator *)
                             CONCAT44(in_stack_ffffffffffffe5ac,in_stack_ffffffffffffe5a8));
          MapIterator::~MapIterator((MapIterator *)in_stack_ffffffffffffe5b0);
          if (!bVar4) break;
          MapIterator::GetKey(&local_f30);
          MapIterator::GetValueRef(&local_f30);
          local_ea0 = (Reflection *)
                      InternalSerializeMapEntry
                                (in_stack_ffffffffffffe5e0,
                                 (MapKey *)
                                 CONCAT17(in_stack_ffffffffffffe5df,in_stack_ffffffffffffe5d8),
                                 (MapValueRef *)in_stack_ffffffffffffe5d0,
                                 (uint8 *)in_stack_ffffffffffffe5c8,
                                 (EpsCopyOutputStream *)in_stack_ffffffffffffe5c0);
          MapIterator::operator++((MapIterator *)in_stack_ffffffffffffe5b0);
        }
        MapIterator::~MapIterator((MapIterator *)in_stack_ffffffffffffe5b0);
      }
      return (uint8 *)local_ea0;
    }
  }
  local_f64 = 0;
  bVar4 = FieldDescriptor::is_repeated((FieldDescriptor *)0x469999);
  if (bVar4) {
    local_f64 = Reflection::FieldSize
                          (in_stack_ffffffffffffe628,(Message *)in_stack_ffffffffffffe620,
                           (FieldDescriptor *)in_stack_ffffffffffffe618);
  }
  else {
    pDVar10 = FieldDescriptor::containing_type(local_e90);
    Descriptor::options(pDVar10);
    bVar4 = MessageOptions::map_entry((MessageOptions *)0x4699e2);
    if (bVar4) {
      local_f64 = 1;
    }
    else {
      bVar4 = Reflection::HasField
                        (in_stack_ffffffffffffe5c8,(Message *)in_stack_ffffffffffffe5c0,
                         (FieldDescriptor *)in_stack_ffffffffffffe5b8);
      if (bVar4) {
        local_f64 = 1;
      }
    }
  }
  std::vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  ::vector((vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
            *)0x469a34);
  if (((1 < local_f64) &&
      (bVar4 = FieldDescriptor::is_map((FieldDescriptor *)in_stack_ffffffffffffe5b0), bVar4)) &&
     (bVar4 = io::EpsCopyOutputStream::IsSerializationDeterministic
                        ((EpsCopyOutputStream *)local_ea8), bVar4)) {
    DynamicMapSorter::Sort
              (in_stack_ffffffffffffe6c8,iVar8,in_stack_ffffffffffffe6b8,
               (FieldDescriptor *)CONCAT44(in_stack_ffffffffffffe6b4,in_stack_ffffffffffffe6b0));
    std::
    vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>::
    operator=((vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
               *)in_stack_ffffffffffffe5c0,
              (vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
               *)in_stack_ffffffffffffe5b8);
    std::
    vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>::
    ~vector((vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
             *)in_stack_ffffffffffffe5c0);
  }
  bVar4 = FieldDescriptor::is_packed((FieldDescriptor *)in_stack_ffffffffffffe5b8);
  if (bVar4) {
    if (local_f64 == 0) {
      local_e88 = local_ea0;
    }
    else {
      io::EpsCopyOutputStream::EnsureSpace
                ((EpsCopyOutputStream *)in_stack_ffffffffffffe5b0,
                 (uint8 **)CONCAT44(in_stack_ffffffffffffe5ac,in_stack_ffffffffffffe5a8));
      TVar6 = FieldDescriptor::type((FieldDescriptor *)in_stack_ffffffffffffe5c0);
      switch(TVar6) {
      case TYPE_DOUBLE:
        Reflection::GetRepeatedField<double>
                  (in_stack_ffffffffffffe5b0,
                   (Message *)CONCAT44(in_stack_ffffffffffffe5ac,in_stack_ffffffffffffe5a8),
                   (FieldDescriptor *)0x46dd1c);
        RepeatedField<double>::RepeatedField
                  ((RepeatedField<double> *)in_stack_ffffffffffffe5c0,
                   (RepeatedField<double> *)in_stack_ffffffffffffe5b8);
        local_b54 = FieldDescriptor::number(local_e90);
        local_b50 = local_ea8;
        local_b60 = &local_1070;
        local_b68 = local_ea0;
        io::EpsCopyOutputStream::EnsureSpace
                  ((EpsCopyOutputStream *)in_stack_ffffffffffffe5b0,
                   (uint8 **)CONCAT44(in_stack_ffffffffffffe5ac,in_stack_ffffffffffffe5a8));
        local_b70 = 8;
        iVar8 = RepeatedField<double>::size(local_b60);
        local_b78 = (long)iVar8 << 3;
        local_630 = local_ea8;
        local_634 = local_b54;
        local_638 = (uint)local_b78;
        local_4b0 = local_ea8;
        local_4b4 = local_b54;
        local_4b8 = 2;
        local_4c0 = local_b68;
        local_49c = local_b54 << 3 | 2;
        local_4a8 = local_b68;
        if (local_49c < 0x80) {
          *(byte *)&local_b68->descriptor_ = (byte)local_49c;
          local_498 = (Reflection *)((long)&local_b68->descriptor_ + 1);
        }
        else {
          *(byte *)&local_b68->descriptor_ = (byte)local_49c | 0x80;
          local_49c = (uint)(local_b54 << 3) >> 7;
          if (local_49c < 0x80) {
            *(byte *)((long)&local_b68->descriptor_ + 1) = (byte)local_49c;
            local_498 = (Reflection *)((long)&local_b68->descriptor_ + 2);
          }
          else {
            pRVar18 = (Reflection *)((long)&local_b68->descriptor_ + 1);
            do {
              local_4a8 = pRVar18;
              *(byte *)local_4a8 = (byte)local_49c | 0x80;
              local_49c = local_49c >> 7;
              pRVar18 = (Reflection *)((long)local_4a8 + 1);
            } while (0x7f < local_49c);
            local_4a8 = (Reflection *)((long)local_4a8 + 2);
            *(byte *)pRVar18 = (byte)local_49c;
            local_498 = local_4a8;
          }
        }
        local_640 = local_498;
        local_3b0 = local_498;
        for (local_3a4 = local_638; 0x7f < local_3a4; local_3a4 = local_3a4 >> 7) {
          *(byte *)&local_3b0->descriptor_ = (byte)local_3a4 | 0x80;
          local_3b0 = (Reflection *)((long)&local_3b0->descriptor_ + 1);
        }
        local_b68 = (Reflection *)((long)&local_3b0->descriptor_ + 1);
        *(byte *)&local_3b0->descriptor_ = (byte)local_3a4;
        local_3b0 = local_b68;
        RepeatedField<double>::data((RepeatedField<double> *)0x46e09c);
        local_ea0 = (Reflection *)
                    io::EpsCopyOutputStream::WriteRawLittleEndian<8>
                              ((EpsCopyOutputStream *)in_stack_ffffffffffffe5c0,
                               in_stack_ffffffffffffe5b8,
                               (int)((ulong)in_stack_ffffffffffffe5b0 >> 0x20),
                               (uint8 *)CONCAT44(in_stack_ffffffffffffe5ac,in_stack_ffffffffffffe5a8
                                                ));
        local_f9c = 8;
        RepeatedField<double>::~RepeatedField((RepeatedField<double> *)in_stack_ffffffffffffe5b0);
        break;
      case TYPE_FLOAT:
        Reflection::GetRepeatedField<float>
                  (in_stack_ffffffffffffe5b0,
                   (Message *)CONCAT44(in_stack_ffffffffffffe5ac,in_stack_ffffffffffffe5a8),
                   (FieldDescriptor *)0x46d8f2);
        RepeatedField<float>::RepeatedField
                  ((RepeatedField<float> *)in_stack_ffffffffffffe5c0,
                   (RepeatedField<float> *)in_stack_ffffffffffffe5b8);
        local_b84 = FieldDescriptor::number(local_e90);
        local_b80 = local_ea8;
        local_b90 = &local_1060;
        local_b98 = local_ea0;
        io::EpsCopyOutputStream::EnsureSpace
                  ((EpsCopyOutputStream *)in_stack_ffffffffffffe5b0,
                   (uint8 **)CONCAT44(in_stack_ffffffffffffe5ac,in_stack_ffffffffffffe5a8));
        local_ba0 = 4;
        iVar8 = RepeatedField<float>::size(local_b90);
        local_ba8 = (long)iVar8 << 2;
        local_618 = local_ea8;
        local_61c = local_b84;
        local_620 = (uint)local_ba8;
        local_4e0 = local_ea8;
        local_4e4 = local_b84;
        local_4e8 = 2;
        local_4f0 = local_b98;
        local_4cc = local_b84 << 3 | 2;
        local_4d8 = local_b98;
        if (local_4cc < 0x80) {
          *(byte *)&local_b98->descriptor_ = (byte)local_4cc;
          local_4c8 = (Reflection *)((long)&local_b98->descriptor_ + 1);
        }
        else {
          *(byte *)&local_b98->descriptor_ = (byte)local_4cc | 0x80;
          local_4cc = (uint)(local_b84 << 3) >> 7;
          if (local_4cc < 0x80) {
            *(byte *)((long)&local_b98->descriptor_ + 1) = (byte)local_4cc;
            local_4c8 = (Reflection *)((long)&local_b98->descriptor_ + 2);
          }
          else {
            pRVar18 = (Reflection *)((long)&local_b98->descriptor_ + 1);
            do {
              local_4d8 = pRVar18;
              *(byte *)local_4d8 = (byte)local_4cc | 0x80;
              local_4cc = local_4cc >> 7;
              pRVar18 = (Reflection *)((long)local_4d8 + 1);
            } while (0x7f < local_4cc);
            local_4d8 = (Reflection *)((long)local_4d8 + 2);
            *(byte *)pRVar18 = (byte)local_4cc;
            local_4c8 = local_4d8;
          }
        }
        local_628 = local_4c8;
        local_3c0 = local_4c8;
        for (local_3b4 = local_620; 0x7f < local_3b4; local_3b4 = local_3b4 >> 7) {
          *(byte *)&local_3c0->descriptor_ = (byte)local_3b4 | 0x80;
          local_3c0 = (Reflection *)((long)&local_3c0->descriptor_ + 1);
        }
        local_b98 = (Reflection *)((long)&local_3c0->descriptor_ + 1);
        *(byte *)&local_3c0->descriptor_ = (byte)local_3b4;
        local_3c0 = local_b98;
        RepeatedField<float>::data((RepeatedField<float> *)0x46dc72);
        local_ea0 = (Reflection *)
                    io::EpsCopyOutputStream::WriteRawLittleEndian<4>
                              ((EpsCopyOutputStream *)in_stack_ffffffffffffe5c0,
                               in_stack_ffffffffffffe5b8,
                               (int)((ulong)in_stack_ffffffffffffe5b0 >> 0x20),
                               (uint8 *)CONCAT44(in_stack_ffffffffffffe5ac,in_stack_ffffffffffffe5a8
                                                ));
        local_f9c = 8;
        RepeatedField<float>::~RepeatedField((RepeatedField<float> *)in_stack_ffffffffffffe5b0);
        break;
      case TYPE_INT64:
        Reflection::GetRepeatedField<long>
                  (in_stack_ffffffffffffe5b0,
                   (Message *)CONCAT44(in_stack_ffffffffffffe5ac,in_stack_ffffffffffffe5a8),
                   (FieldDescriptor *)0x46a23f);
        RepeatedField<long>::RepeatedField
                  ((RepeatedField<long> *)in_stack_ffffffffffffe5c0,
                   (RepeatedField<long> *)in_stack_ffffffffffffe5b8);
        iVar8 = FieldDescriptor::number(local_e90);
        sVar12 = FieldDataOnlyByteSize(in_stack_ffffffffffffe738,in_stack_ffffffffffffe730);
        local_d38 = local_ea8;
        local_d48 = &local_fc0;
        local_d4c = (uint)sVar12;
        local_d58 = local_ea0;
        local_338 = local_ea8;
        local_358 = local_ea0;
        local_360 = io::EpsCopyOutputStream::Encode64;
        local_d3c = iVar8;
        local_34c = local_d4c;
        local_348 = local_d48;
        local_33c = iVar8;
        io::EpsCopyOutputStream::EnsureSpace
                  ((EpsCopyOutputStream *)in_stack_ffffffffffffe5b0,
                   (uint8 **)CONCAT44(in_stack_ffffffffffffe5ac,in_stack_ffffffffffffe5a8));
        local_308 = local_ea8;
        local_30c = local_33c;
        local_310 = local_34c;
        local_2f0 = local_ea8;
        local_2f4 = local_33c;
        local_2f8 = 2;
        local_300 = local_358;
        local_2dc = local_33c << 3 | 2;
        local_2e8 = local_358;
        if (local_2dc < 0x80) {
          *(byte *)&local_358->descriptor_ = (byte)local_2dc;
          local_2d8 = (Reflection *)((long)&local_358->descriptor_ + 1);
        }
        else {
          *(byte *)&local_358->descriptor_ = (byte)local_2dc | 0x80;
          local_2dc = (uint)(local_33c << 3) >> 7;
          if (local_2dc < 0x80) {
            *(byte *)((long)&local_358->descriptor_ + 1) = (byte)local_2dc;
            local_2d8 = (Reflection *)((long)&local_358->descriptor_ + 2);
          }
          else {
            pRVar18 = (Reflection *)((long)&local_358->descriptor_ + 1);
            do {
              local_2e8 = pRVar18;
              *(byte *)local_2e8 = (byte)local_2dc | 0x80;
              local_2dc = local_2dc >> 7;
              pRVar18 = (Reflection *)((long)local_2e8 + 1);
            } while (0x7f < local_2dc);
            local_2e8 = (Reflection *)((long)local_2e8 + 2);
            *(byte *)pRVar18 = (byte)local_2dc;
            local_2d8 = local_2e8;
          }
        }
        local_318 = local_2d8;
        local_2d0 = local_2d8;
        for (local_2c4 = local_34c; 0x7f < local_2c4; local_2c4 = local_2c4 >> 7) {
          *(byte *)&local_2d0->descriptor_ = (byte)local_2c4 | 0x80;
          local_2d0 = (Reflection *)((long)&local_2d0->descriptor_ + 1);
        }
        local_358 = (Reflection *)((long)&local_2d0->descriptor_ + 1);
        *(byte *)&local_2d0->descriptor_ = (byte)local_2c4;
        local_2d0 = local_358;
        plVar13 = RepeatedField<long>::data((RepeatedField<long> *)0x46a5ed);
        local_368 = plVar13;
        iVar8 = RepeatedField<long>::size(local_348);
        local_370 = plVar13 + iVar8;
        do {
          io::EpsCopyOutputStream::EnsureSpace
                    ((EpsCopyOutputStream *)in_stack_ffffffffffffe5b0,
                     (uint8 **)CONCAT44(in_stack_ffffffffffffe5ac,in_stack_ffffffffffffe5a8));
          lVar2 = *local_368;
          local_368 = local_368 + 1;
          local_328 = (*local_360)(lVar2);
          local_330 = local_358;
          if (local_328 < 0x80) {
            *(byte *)&local_358->descriptor_ = (byte)local_328;
            local_320 = (Reflection *)((long)&local_358->descriptor_ + 1);
          }
          else {
            *(byte *)&local_358->descriptor_ = (byte)local_328 | 0x80;
            local_328 = local_328 >> 7;
            if (local_328 < 0x80) {
              *(byte *)((long)&local_358->descriptor_ + 1) = (byte)local_328;
              local_320 = (Reflection *)((long)&local_358->descriptor_ + 2);
            }
            else {
              pRVar18 = (Reflection *)((long)&local_358->descriptor_ + 1);
              do {
                local_330 = pRVar18;
                *(byte *)local_330 = (byte)local_328 | 0x80;
                local_328 = local_328 >> 7;
                pRVar18 = (Reflection *)((long)local_330 + 1);
              } while (0x7f < local_328);
              local_330 = (Reflection *)((long)local_330 + 2);
              *(byte *)pRVar18 = (byte)local_328;
              local_320 = local_330;
            }
          }
          local_358 = local_320;
        } while (local_368 < local_370);
        local_ea0 = local_320;
        local_f9c = 8;
        RepeatedField<long>::~RepeatedField((RepeatedField<long> *)in_stack_ffffffffffffe5b0);
        break;
      case TYPE_UINT64:
        Reflection::GetRepeatedField<unsigned_long>
                  (in_stack_ffffffffffffe5b0,
                   (Message *)CONCAT44(in_stack_ffffffffffffe5ac,in_stack_ffffffffffffe5a8),
                   (FieldDescriptor *)0x46bb77);
        RepeatedField<unsigned_long>::RepeatedField
                  ((RepeatedField<unsigned_long> *)in_stack_ffffffffffffe5c0,
                   (RepeatedField<unsigned_long> *)in_stack_ffffffffffffe5b8);
        iVar8 = FieldDescriptor::number(local_e90);
        sVar12 = FieldDataOnlyByteSize(in_stack_ffffffffffffe738,in_stack_ffffffffffffe730);
        local_c98 = local_ea8;
        local_ca8 = &local_1000;
        local_cac = (uint)sVar12;
        local_cb8 = local_ea0;
        local_78 = local_ea8;
        local_98 = local_ea0;
        local_a0 = io::EpsCopyOutputStream::Encode64;
        local_c9c = iVar8;
        local_8c = local_cac;
        local_88 = local_ca8;
        local_7c = iVar8;
        io::EpsCopyOutputStream::EnsureSpace
                  ((EpsCopyOutputStream *)in_stack_ffffffffffffe5b0,
                   (uint8 **)CONCAT44(in_stack_ffffffffffffe5ac,in_stack_ffffffffffffe5a8));
        local_48 = local_ea8;
        local_4c = local_7c;
        local_50 = local_8c;
        local_30 = local_ea8;
        local_34 = local_7c;
        local_38 = 2;
        local_40 = local_98;
        local_1c = local_7c << 3 | 2;
        local_28 = local_98;
        if (local_1c < 0x80) {
          *(byte *)&local_98->descriptor_ = (byte)local_1c;
          local_18 = (Reflection *)((long)&local_98->descriptor_ + 1);
        }
        else {
          *(byte *)&local_98->descriptor_ = (byte)local_1c | 0x80;
          local_1c = (uint)(local_7c << 3) >> 7;
          if (local_1c < 0x80) {
            *(byte *)((long)&local_98->descriptor_ + 1) = (byte)local_1c;
            local_18 = (Reflection *)((long)&local_98->descriptor_ + 2);
          }
          else {
            pRVar18 = (Reflection *)((long)&local_98->descriptor_ + 1);
            do {
              local_28 = pRVar18;
              *(byte *)local_28 = (byte)local_1c | 0x80;
              local_1c = local_1c >> 7;
              pRVar18 = (Reflection *)((long)local_28 + 1);
            } while (0x7f < local_1c);
            local_28 = (Reflection *)((long)local_28 + 2);
            *(byte *)pRVar18 = (byte)local_1c;
            local_18 = local_28;
          }
        }
        local_58 = local_18;
        local_10 = local_18;
        for (local_4 = local_8c; 0x7f < local_4; local_4 = local_4 >> 7) {
          *(byte *)&local_10->descriptor_ = (byte)local_4 | 0x80;
          local_10 = (Reflection *)((long)&local_10->descriptor_ + 1);
        }
        local_98 = (Reflection *)((long)&local_10->descriptor_ + 1);
        *(byte *)&local_10->descriptor_ = (byte)local_4;
        local_10 = local_98;
        puVar15 = RepeatedField<unsigned_long>::data((RepeatedField<unsigned_long> *)0x46bf25);
        local_a8 = puVar15;
        iVar8 = RepeatedField<unsigned_long>::size(local_88);
        local_b0 = puVar15 + iVar8;
        do {
          io::EpsCopyOutputStream::EnsureSpace
                    ((EpsCopyOutputStream *)in_stack_ffffffffffffe5b0,
                     (uint8 **)CONCAT44(in_stack_ffffffffffffe5ac,in_stack_ffffffffffffe5a8));
          uVar3 = *local_a8;
          local_a8 = local_a8 + 1;
          local_68 = (*local_a0)(uVar3);
          local_70 = local_98;
          if (local_68 < 0x80) {
            *(byte *)&local_98->descriptor_ = (byte)local_68;
            local_60 = (Reflection *)((long)&local_98->descriptor_ + 1);
          }
          else {
            *(byte *)&local_98->descriptor_ = (byte)local_68 | 0x80;
            local_68 = local_68 >> 7;
            if (local_68 < 0x80) {
              *(byte *)((long)&local_98->descriptor_ + 1) = (byte)local_68;
              local_60 = (Reflection *)((long)&local_98->descriptor_ + 2);
            }
            else {
              pRVar18 = (Reflection *)((long)&local_98->descriptor_ + 1);
              do {
                local_70 = pRVar18;
                *(byte *)local_70 = (byte)local_68 | 0x80;
                local_68 = local_68 >> 7;
                pRVar18 = (Reflection *)((long)local_70 + 1);
              } while (0x7f < local_68);
              local_70 = (Reflection *)((long)local_70 + 2);
              *(byte *)pRVar18 = (byte)local_68;
              local_60 = local_70;
            }
          }
          local_98 = local_60;
        } while (local_a8 < local_b0);
        local_ea0 = local_60;
        local_f9c = 8;
        RepeatedField<unsigned_long>::~RepeatedField
                  ((RepeatedField<unsigned_long> *)in_stack_ffffffffffffe5b0);
        break;
      case TYPE_INT32:
        Reflection::GetRepeatedField<int>
                  (in_stack_ffffffffffffe5b0,
                   (Message *)CONCAT44(in_stack_ffffffffffffe5ac,in_stack_ffffffffffffe5a8),
                   (FieldDescriptor *)0x469bc4);
        RepeatedField<int>::RepeatedField
                  ((RepeatedField<int> *)in_stack_ffffffffffffe5c0,
                   (RepeatedField<int> *)in_stack_ffffffffffffe5b8);
        iVar8 = FieldDescriptor::number(local_e90);
        sVar12 = FieldDataOnlyByteSize(in_stack_ffffffffffffe738,in_stack_ffffffffffffe730);
        local_d60 = local_ea8;
        local_d70 = &local_fb0;
        local_d74 = (uint)sVar12;
        local_d80 = local_ea0;
        local_6a8 = local_ea8;
        local_6c8 = local_ea0;
        local_6d0 = io::EpsCopyOutputStream::Encode64;
        local_d64 = iVar8;
        local_6bc = local_d74;
        local_6b8 = local_d70;
        local_6ac = iVar8;
        io::EpsCopyOutputStream::EnsureSpace
                  ((EpsCopyOutputStream *)in_stack_ffffffffffffe5b0,
                   (uint8 **)CONCAT44(in_stack_ffffffffffffe5ac,in_stack_ffffffffffffe5a8));
        local_678 = local_ea8;
        local_67c = local_6ac;
        local_680 = local_6bc;
        local_420 = local_ea8;
        local_424 = local_6ac;
        local_428 = 2;
        local_430 = local_6c8;
        local_40c = local_6ac << 3 | 2;
        local_418 = local_6c8;
        if (local_40c < 0x80) {
          *(byte *)&local_6c8->descriptor_ = (byte)local_40c;
          local_408 = (Reflection *)((long)&local_6c8->descriptor_ + 1);
        }
        else {
          *(byte *)&local_6c8->descriptor_ = (byte)local_40c | 0x80;
          local_40c = (uint)(local_6ac << 3) >> 7;
          if (local_40c < 0x80) {
            *(byte *)((long)&local_6c8->descriptor_ + 1) = (byte)local_40c;
            local_408 = (Reflection *)((long)&local_6c8->descriptor_ + 2);
          }
          else {
            pRVar18 = (Reflection *)((long)&local_6c8->descriptor_ + 1);
            do {
              local_418 = pRVar18;
              *(byte *)local_418 = (byte)local_40c | 0x80;
              local_40c = local_40c >> 7;
              pRVar18 = (Reflection *)((long)local_418 + 1);
            } while (0x7f < local_40c);
            local_418 = (Reflection *)((long)local_418 + 2);
            *(byte *)pRVar18 = (byte)local_40c;
            local_408 = local_418;
          }
        }
        local_688 = local_408;
        local_380 = local_408;
        for (local_374 = local_6bc; 0x7f < local_374; local_374 = local_374 >> 7) {
          *(byte *)&local_380->descriptor_ = (byte)local_374 | 0x80;
          local_380 = (Reflection *)((long)&local_380->descriptor_ + 1);
        }
        local_6c8 = (Reflection *)((long)&local_380->descriptor_ + 1);
        *(byte *)&local_380->descriptor_ = (byte)local_374;
        local_380 = local_6c8;
        piVar11 = RepeatedField<int>::data((RepeatedField<int> *)0x469f95);
        local_6d8 = piVar11;
        iVar8 = RepeatedField<int>::size(local_6b8);
        local_6e0 = piVar11 + iVar8;
        do {
          io::EpsCopyOutputStream::EnsureSpace
                    ((EpsCopyOutputStream *)in_stack_ffffffffffffe5b0,
                     (uint8 **)CONCAT44(in_stack_ffffffffffffe5ac,in_stack_ffffffffffffe5a8));
          iVar8 = *local_6d8;
          local_6d8 = local_6d8 + 1;
          local_698 = (*local_6d0)((long)iVar8);
          local_6a0 = local_6c8;
          if (local_698 < 0x80) {
            *(byte *)&local_6c8->descriptor_ = (byte)local_698;
            local_690 = (Reflection *)((long)&local_6c8->descriptor_ + 1);
          }
          else {
            *(byte *)&local_6c8->descriptor_ = (byte)local_698 | 0x80;
            local_698 = local_698 >> 7;
            if (local_698 < 0x80) {
              *(byte *)((long)&local_6c8->descriptor_ + 1) = (byte)local_698;
              local_690 = (Reflection *)((long)&local_6c8->descriptor_ + 2);
            }
            else {
              pRVar18 = (Reflection *)((long)&local_6c8->descriptor_ + 1);
              do {
                local_6a0 = pRVar18;
                *(byte *)local_6a0 = (byte)local_698 | 0x80;
                local_698 = local_698 >> 7;
                pRVar18 = (Reflection *)((long)local_6a0 + 1);
              } while (0x7f < local_698);
              local_6a0 = (Reflection *)((long)local_6a0 + 2);
              *(byte *)pRVar18 = (byte)local_698;
              local_690 = local_6a0;
            }
          }
          local_6c8 = local_690;
        } while (local_6d8 < local_6e0);
        local_ea0 = local_690;
        local_f9c = 8;
        RepeatedField<int>::~RepeatedField((RepeatedField<int> *)in_stack_ffffffffffffe5b0);
        break;
      case TYPE_FIXED64:
        Reflection::GetRepeatedField<unsigned_long>
                  (in_stack_ffffffffffffe5b0,
                   (Message *)CONCAT44(in_stack_ffffffffffffe5ac,in_stack_ffffffffffffe5a8),
                   (FieldDescriptor *)0x46cc74);
        RepeatedField<unsigned_long>::RepeatedField
                  ((RepeatedField<unsigned_long> *)in_stack_ffffffffffffe5c0,
                   (RepeatedField<unsigned_long> *)in_stack_ffffffffffffe5b8);
        local_c14 = FieldDescriptor::number(local_e90);
        local_c10 = local_ea8;
        local_c20 = &local_1030;
        local_c28 = local_ea0;
        io::EpsCopyOutputStream::EnsureSpace
                  ((EpsCopyOutputStream *)in_stack_ffffffffffffe5b0,
                   (uint8 **)CONCAT44(in_stack_ffffffffffffe5ac,in_stack_ffffffffffffe5a8));
        local_c30 = 8;
        iVar8 = RepeatedField<unsigned_long>::size(local_c20);
        local_c38 = (long)iVar8 << 3;
        local_5d0 = local_ea8;
        local_5d4 = local_c14;
        local_5d8 = (uint)local_c38;
        local_570 = local_ea8;
        local_574 = local_c14;
        local_578 = 2;
        local_580 = local_c28;
        local_55c = local_c14 << 3 | 2;
        local_568 = local_c28;
        if (local_55c < 0x80) {
          *(byte *)&local_c28->descriptor_ = (byte)local_55c;
          local_558 = (Reflection *)((long)&local_c28->descriptor_ + 1);
        }
        else {
          *(byte *)&local_c28->descriptor_ = (byte)local_55c | 0x80;
          local_55c = (uint)(local_c14 << 3) >> 7;
          if (local_55c < 0x80) {
            *(byte *)((long)&local_c28->descriptor_ + 1) = (byte)local_55c;
            local_558 = (Reflection *)((long)&local_c28->descriptor_ + 2);
          }
          else {
            pRVar18 = (Reflection *)((long)&local_c28->descriptor_ + 1);
            do {
              local_568 = pRVar18;
              *(byte *)local_568 = (byte)local_55c | 0x80;
              local_55c = local_55c >> 7;
              pRVar18 = (Reflection *)((long)local_568 + 1);
            } while (0x7f < local_55c);
            local_568 = (Reflection *)((long)local_568 + 2);
            *(byte *)pRVar18 = (byte)local_55c;
            local_558 = local_568;
          }
        }
        local_5e0 = local_558;
        local_3f0 = local_558;
        for (local_3e4 = local_5d8; 0x7f < local_3e4; local_3e4 = local_3e4 >> 7) {
          *(byte *)&local_3f0->descriptor_ = (byte)local_3e4 | 0x80;
          local_3f0 = (Reflection *)((long)&local_3f0->descriptor_ + 1);
        }
        local_c28 = (Reflection *)((long)&local_3f0->descriptor_ + 1);
        *(byte *)&local_3f0->descriptor_ = (byte)local_3e4;
        local_3f0 = local_c28;
        RepeatedField<unsigned_long>::data((RepeatedField<unsigned_long> *)0x46cff4);
        local_ea0 = (Reflection *)
                    io::EpsCopyOutputStream::WriteRawLittleEndian<8>
                              ((EpsCopyOutputStream *)in_stack_ffffffffffffe5c0,
                               in_stack_ffffffffffffe5b8,
                               (int)((ulong)in_stack_ffffffffffffe5b0 >> 0x20),
                               (uint8 *)CONCAT44(in_stack_ffffffffffffe5ac,in_stack_ffffffffffffe5a8
                                                ));
        local_f9c = 8;
        RepeatedField<unsigned_long>::~RepeatedField
                  ((RepeatedField<unsigned_long> *)in_stack_ffffffffffffe5b0);
        break;
      case TYPE_FIXED32:
        Reflection::GetRepeatedField<unsigned_int>
                  (in_stack_ffffffffffffe5b0,
                   (Message *)CONCAT44(in_stack_ffffffffffffe5ac,in_stack_ffffffffffffe5a8),
                   (FieldDescriptor *)0x46c84a);
        RepeatedField<unsigned_int>::RepeatedField
                  ((RepeatedField<unsigned_int> *)in_stack_ffffffffffffe5c0,
                   (RepeatedField<unsigned_int> *)in_stack_ffffffffffffe5b8);
        local_c44 = FieldDescriptor::number(local_e90);
        local_c40 = local_ea8;
        local_c50 = &local_1020;
        local_c58 = local_ea0;
        io::EpsCopyOutputStream::EnsureSpace
                  ((EpsCopyOutputStream *)in_stack_ffffffffffffe5b0,
                   (uint8 **)CONCAT44(in_stack_ffffffffffffe5ac,in_stack_ffffffffffffe5a8));
        local_c60 = 4;
        iVar8 = RepeatedField<unsigned_int>::size(local_c50);
        local_c68 = (long)iVar8 << 2;
        local_5b8 = local_ea8;
        local_5bc = local_c44;
        local_5c0 = (uint)local_c68;
        local_5a0 = local_ea8;
        local_5a4 = local_c44;
        local_5a8 = 2;
        local_5b0 = local_c58;
        local_58c = local_c44 << 3 | 2;
        local_598 = local_c58;
        if (local_58c < 0x80) {
          *(byte *)&local_c58->descriptor_ = (byte)local_58c;
          local_588 = (Reflection *)((long)&local_c58->descriptor_ + 1);
        }
        else {
          *(byte *)&local_c58->descriptor_ = (byte)local_58c | 0x80;
          local_58c = (uint)(local_c44 << 3) >> 7;
          if (local_58c < 0x80) {
            *(byte *)((long)&local_c58->descriptor_ + 1) = (byte)local_58c;
            local_588 = (Reflection *)((long)&local_c58->descriptor_ + 2);
          }
          else {
            pRVar18 = (Reflection *)((long)&local_c58->descriptor_ + 1);
            do {
              local_598 = pRVar18;
              *(byte *)local_598 = (byte)local_58c | 0x80;
              local_58c = local_58c >> 7;
              pRVar18 = (Reflection *)((long)local_598 + 1);
            } while (0x7f < local_58c);
            local_598 = (Reflection *)((long)local_598 + 2);
            *(byte *)pRVar18 = (byte)local_58c;
            local_588 = local_598;
          }
        }
        local_5c8 = local_588;
        local_400 = local_588;
        for (local_3f4 = local_5c0; 0x7f < local_3f4; local_3f4 = local_3f4 >> 7) {
          *(byte *)&local_400->descriptor_ = (byte)local_3f4 | 0x80;
          local_400 = (Reflection *)((long)&local_400->descriptor_ + 1);
        }
        local_c58 = (Reflection *)((long)&local_400->descriptor_ + 1);
        *(byte *)&local_400->descriptor_ = (byte)local_3f4;
        local_400 = local_c58;
        RepeatedField<unsigned_int>::data((RepeatedField<unsigned_int> *)0x46cbca);
        local_ea0 = (Reflection *)
                    io::EpsCopyOutputStream::WriteRawLittleEndian<4>
                              ((EpsCopyOutputStream *)in_stack_ffffffffffffe5c0,
                               in_stack_ffffffffffffe5b8,
                               (int)((ulong)in_stack_ffffffffffffe5b0 >> 0x20),
                               (uint8 *)CONCAT44(in_stack_ffffffffffffe5ac,in_stack_ffffffffffffe5a8
                                                ));
        local_f9c = 8;
        RepeatedField<unsigned_int>::~RepeatedField
                  ((RepeatedField<unsigned_int> *)in_stack_ffffffffffffe5b0);
        break;
      case TYPE_BOOL:
        Reflection::GetRepeatedField<bool>
                  (in_stack_ffffffffffffe5b0,
                   (Message *)CONCAT44(in_stack_ffffffffffffe5ac,in_stack_ffffffffffffe5a8),
                   (FieldDescriptor *)0x46e146);
        RepeatedField<bool>::RepeatedField
                  ((RepeatedField<bool> *)in_stack_ffffffffffffe5c0,
                   (RepeatedField<bool> *)in_stack_ffffffffffffe5b8);
        local_b24 = FieldDescriptor::number(local_e90);
        local_b20 = local_ea8;
        local_b30 = &local_1080;
        local_b38 = local_ea0;
        io::EpsCopyOutputStream::EnsureSpace
                  ((EpsCopyOutputStream *)in_stack_ffffffffffffe5b0,
                   (uint8 **)CONCAT44(in_stack_ffffffffffffe5ac,in_stack_ffffffffffffe5a8));
        local_b40 = 1;
        local_650 = RepeatedField<bool>::size(local_b30);
        local_b48 = (long)(int)local_650;
        local_648 = local_ea8;
        local_64c = local_b24;
        local_480 = local_ea8;
        local_484 = local_b24;
        local_488 = 2;
        local_490 = local_b38;
        local_46c = local_b24 << 3 | 2;
        local_478 = local_b38;
        if (local_46c < 0x80) {
          *(byte *)&local_b38->descriptor_ = (byte)local_46c;
          local_468 = (Reflection *)((long)&local_b38->descriptor_ + 1);
        }
        else {
          *(byte *)&local_b38->descriptor_ = (byte)local_46c | 0x80;
          local_46c = (uint)(local_b24 << 3) >> 7;
          if (local_46c < 0x80) {
            *(byte *)((long)&local_b38->descriptor_ + 1) = (byte)local_46c;
            local_468 = (Reflection *)((long)&local_b38->descriptor_ + 2);
          }
          else {
            pRVar18 = (Reflection *)((long)&local_b38->descriptor_ + 1);
            do {
              local_478 = pRVar18;
              *(byte *)local_478 = (byte)local_46c | 0x80;
              local_46c = local_46c >> 7;
              pRVar18 = (Reflection *)((long)local_478 + 1);
            } while (0x7f < local_46c);
            local_478 = (Reflection *)((long)local_478 + 2);
            *(byte *)pRVar18 = (byte)local_46c;
            local_468 = local_478;
          }
        }
        local_658 = local_468;
        local_3a0 = local_468;
        for (local_394 = local_650; 0x7f < local_394; local_394 = local_394 >> 7) {
          *(byte *)&local_3a0->descriptor_ = (byte)local_394 | 0x80;
          local_3a0 = (Reflection *)((long)&local_3a0->descriptor_ + 1);
        }
        local_b38 = (Reflection *)((long)&local_3a0->descriptor_ + 1);
        *(byte *)&local_3a0->descriptor_ = (byte)local_394;
        local_3a0 = local_b38;
        RepeatedField<bool>::data((RepeatedField<bool> *)0x46e4c2);
        local_ea0 = (Reflection *)
                    io::EpsCopyOutputStream::WriteRawLittleEndian<1>
                              ((EpsCopyOutputStream *)in_stack_ffffffffffffe5c0,
                               in_stack_ffffffffffffe5b8,
                               (int)((ulong)in_stack_ffffffffffffe5b0 >> 0x20),
                               (uint8 *)CONCAT44(in_stack_ffffffffffffe5ac,in_stack_ffffffffffffe5a8
                                                ));
        local_f9c = 8;
        RepeatedField<bool>::~RepeatedField((RepeatedField<bool> *)in_stack_ffffffffffffe5b0);
        break;
      default:
        LogMessage::LogMessage
                  ((LogMessage *)in_stack_ffffffffffffe5c0,
                   (LogLevel_conflict)((ulong)in_stack_ffffffffffffe5b8 >> 0x20),
                   (char *)in_stack_ffffffffffffe5b0,in_stack_ffffffffffffe5ac);
        LogMessage::operator<<
                  ((LogMessage *)in_stack_ffffffffffffe5b0,
                   (char *)CONCAT44(in_stack_ffffffffffffe5ac,in_stack_ffffffffffffe5a8));
        LogFinisher::operator=
                  ((LogFinisher *)in_stack_ffffffffffffe5b0,
                   (LogMessage *)CONCAT44(in_stack_ffffffffffffe5ac,in_stack_ffffffffffffe5a8));
        LogMessage::~LogMessage((LogMessage *)0x46e5b1);
        break;
      case TYPE_UINT32:
        Reflection::GetRepeatedField<unsigned_int>
                  (in_stack_ffffffffffffe5b0,
                   (Message *)CONCAT44(in_stack_ffffffffffffe5ac,in_stack_ffffffffffffe5a8),
                   (FieldDescriptor *)0x46b533);
        RepeatedField<unsigned_int>::RepeatedField
                  ((RepeatedField<unsigned_int> *)in_stack_ffffffffffffe5c0,
                   (RepeatedField<unsigned_int> *)in_stack_ffffffffffffe5b8);
        iVar8 = FieldDescriptor::number(local_e90);
        sVar12 = FieldDataOnlyByteSize(in_stack_ffffffffffffe738,in_stack_ffffffffffffe730);
        local_cc0 = local_ea8;
        local_cd0 = &local_ff0;
        local_cd4 = (uint)sVar12;
        local_ce0 = local_ea0;
        local_128 = local_ea8;
        local_148 = local_ea0;
        local_150 = io::EpsCopyOutputStream::Encode32;
        local_cc4 = iVar8;
        local_13c = local_cd4;
        local_138 = local_cd0;
        local_12c = iVar8;
        io::EpsCopyOutputStream::EnsureSpace
                  ((EpsCopyOutputStream *)in_stack_ffffffffffffe5b0,
                   (uint8 **)CONCAT44(in_stack_ffffffffffffe5ac,in_stack_ffffffffffffe5a8));
        local_f8 = local_ea8;
        local_fc = local_12c;
        local_100 = local_13c;
        local_e0 = local_ea8;
        local_e4 = local_12c;
        local_e8 = 2;
        local_f0 = local_148;
        local_cc = local_12c << 3 | 2;
        local_d8 = local_148;
        if (local_cc < 0x80) {
          *(byte *)&local_148->descriptor_ = (byte)local_cc;
          local_c8 = (Reflection *)((long)&local_148->descriptor_ + 1);
        }
        else {
          *(byte *)&local_148->descriptor_ = (byte)local_cc | 0x80;
          local_cc = (uint)(local_12c << 3) >> 7;
          if (local_cc < 0x80) {
            *(byte *)((long)&local_148->descriptor_ + 1) = (byte)local_cc;
            local_c8 = (Reflection *)((long)&local_148->descriptor_ + 2);
          }
          else {
            pRVar18 = (Reflection *)((long)&local_148->descriptor_ + 1);
            do {
              local_d8 = pRVar18;
              *(byte *)local_d8 = (byte)local_cc | 0x80;
              local_cc = local_cc >> 7;
              pRVar18 = (Reflection *)((long)local_d8 + 1);
            } while (0x7f < local_cc);
            local_d8 = (Reflection *)((long)local_d8 + 2);
            *(byte *)pRVar18 = (byte)local_cc;
            local_c8 = local_d8;
          }
        }
        local_108 = local_c8;
        local_c0 = local_c8;
        for (local_b4 = local_13c; 0x7f < local_b4; local_b4 = local_b4 >> 7) {
          *(byte *)&local_c0->descriptor_ = (byte)local_b4 | 0x80;
          local_c0 = (Reflection *)((long)&local_c0->descriptor_ + 1);
        }
        local_148 = (Reflection *)((long)&local_c0->descriptor_ + 1);
        *(byte *)&local_c0->descriptor_ = (byte)local_b4;
        local_c0 = local_148;
        puVar14 = RepeatedField<unsigned_int>::data((RepeatedField<unsigned_int> *)0x46b8e1);
        local_158 = puVar14;
        iVar8 = RepeatedField<unsigned_int>::size(local_138);
        local_160 = puVar14 + iVar8;
        do {
          io::EpsCopyOutputStream::EnsureSpace
                    ((EpsCopyOutputStream *)in_stack_ffffffffffffe5b0,
                     (uint8 **)CONCAT44(in_stack_ffffffffffffe5ac,in_stack_ffffffffffffe5a8));
          uVar1 = *local_158;
          local_158 = local_158 + 1;
          local_114 = (*local_150)(uVar1);
          local_120 = local_148;
          if (local_114 < 0x80) {
            *(byte *)&local_148->descriptor_ = (byte)local_114;
            local_110 = (Reflection *)((long)&local_148->descriptor_ + 1);
          }
          else {
            *(byte *)&local_148->descriptor_ = (byte)local_114 | 0x80;
            local_114 = local_114 >> 7;
            if (local_114 < 0x80) {
              *(byte *)((long)&local_148->descriptor_ + 1) = (byte)local_114;
              local_110 = (Reflection *)((long)&local_148->descriptor_ + 2);
            }
            else {
              pRVar18 = (Reflection *)((long)&local_148->descriptor_ + 1);
              do {
                local_120 = pRVar18;
                *(byte *)local_120 = (byte)local_114 | 0x80;
                local_114 = local_114 >> 7;
                pRVar18 = (Reflection *)((long)local_120 + 1);
              } while (0x7f < local_114);
              local_120 = (Reflection *)((long)local_120 + 2);
              *(byte *)pRVar18 = (byte)local_114;
              local_110 = local_120;
            }
          }
          local_148 = local_110;
        } while (local_158 < local_160);
        local_ea0 = local_110;
        local_f9c = 8;
        RepeatedField<unsigned_int>::~RepeatedField
                  ((RepeatedField<unsigned_int> *)in_stack_ffffffffffffe5b0);
        break;
      case TYPE_ENUM:
        Reflection::GetRepeatedField<int>
                  (in_stack_ffffffffffffe5b0,
                   (Message *)CONCAT44(in_stack_ffffffffffffe5ac,in_stack_ffffffffffffe5a8),
                   (FieldDescriptor *)0x46c1cf);
        RepeatedField<int>::RepeatedField
                  ((RepeatedField<int> *)in_stack_ffffffffffffe5c0,
                   (RepeatedField<int> *)in_stack_ffffffffffffe5b8);
        iVar8 = FieldDescriptor::number(local_e90);
        sVar12 = FieldDataOnlyByteSize(in_stack_ffffffffffffe738,in_stack_ffffffffffffe730);
        local_c70 = local_ea8;
        local_c80 = &local_1010;
        local_c84 = (uint)sVar12;
        local_c90 = local_ea0;
        local_700 = local_ea8;
        local_720 = local_ea0;
        local_728 = io::EpsCopyOutputStream::Encode64;
        local_c74 = iVar8;
        local_714 = local_c84;
        local_710 = local_c80;
        local_704 = iVar8;
        io::EpsCopyOutputStream::EnsureSpace
                  ((EpsCopyOutputStream *)in_stack_ffffffffffffe5b0,
                   (uint8 **)CONCAT44(in_stack_ffffffffffffe5ac,in_stack_ffffffffffffe5a8));
        local_660 = local_ea8;
        local_664 = local_704;
        local_668 = local_714;
        local_450 = local_ea8;
        local_454 = local_704;
        local_458 = 2;
        local_460 = local_720;
        local_43c = local_704 << 3 | 2;
        local_448 = local_720;
        if (local_43c < 0x80) {
          *(byte *)&local_720->descriptor_ = (byte)local_43c;
          local_438 = (Reflection *)((long)&local_720->descriptor_ + 1);
        }
        else {
          *(byte *)&local_720->descriptor_ = (byte)local_43c | 0x80;
          local_43c = (uint)(local_704 << 3) >> 7;
          if (local_43c < 0x80) {
            *(byte *)((long)&local_720->descriptor_ + 1) = (byte)local_43c;
            local_438 = (Reflection *)((long)&local_720->descriptor_ + 2);
          }
          else {
            pRVar18 = (Reflection *)((long)&local_720->descriptor_ + 1);
            do {
              local_448 = pRVar18;
              *(byte *)local_448 = (byte)local_43c | 0x80;
              local_43c = local_43c >> 7;
              pRVar18 = (Reflection *)((long)local_448 + 1);
            } while (0x7f < local_43c);
            local_448 = (Reflection *)((long)local_448 + 2);
            *(byte *)pRVar18 = (byte)local_43c;
            local_438 = local_448;
          }
        }
        local_670 = local_438;
        local_390 = local_438;
        for (local_384 = local_714; 0x7f < local_384; local_384 = local_384 >> 7) {
          *(byte *)&local_390->descriptor_ = (byte)local_384 | 0x80;
          local_390 = (Reflection *)((long)&local_390->descriptor_ + 1);
        }
        local_720 = (Reflection *)((long)&local_390->descriptor_ + 1);
        *(byte *)&local_390->descriptor_ = (byte)local_384;
        local_390 = local_720;
        piVar11 = RepeatedField<int>::data((RepeatedField<int> *)0x46c5a0);
        local_730 = piVar11;
        iVar8 = RepeatedField<int>::size(local_710);
        local_738 = piVar11 + iVar8;
        do {
          io::EpsCopyOutputStream::EnsureSpace
                    ((EpsCopyOutputStream *)in_stack_ffffffffffffe5b0,
                     (uint8 **)CONCAT44(in_stack_ffffffffffffe5ac,in_stack_ffffffffffffe5a8));
          iVar8 = *local_730;
          local_730 = local_730 + 1;
          local_6f0 = (*local_728)((long)iVar8);
          local_6f8 = local_720;
          if (local_6f0 < 0x80) {
            *(byte *)&local_720->descriptor_ = (byte)local_6f0;
            local_6e8 = (Reflection *)((long)&local_720->descriptor_ + 1);
          }
          else {
            *(byte *)&local_720->descriptor_ = (byte)local_6f0 | 0x80;
            local_6f0 = local_6f0 >> 7;
            if (local_6f0 < 0x80) {
              *(byte *)((long)&local_720->descriptor_ + 1) = (byte)local_6f0;
              local_6e8 = (Reflection *)((long)&local_720->descriptor_ + 2);
            }
            else {
              pRVar18 = (Reflection *)((long)&local_720->descriptor_ + 1);
              do {
                local_6f8 = pRVar18;
                *(byte *)local_6f8 = (byte)local_6f0 | 0x80;
                local_6f0 = local_6f0 >> 7;
                pRVar18 = (Reflection *)((long)local_6f8 + 1);
              } while (0x7f < local_6f0);
              local_6f8 = (Reflection *)((long)local_6f8 + 2);
              *(byte *)pRVar18 = (byte)local_6f0;
              local_6e8 = local_6f8;
            }
          }
          local_720 = local_6e8;
        } while (local_730 < local_738);
        local_ea0 = local_6e8;
        local_f9c = 8;
        RepeatedField<int>::~RepeatedField((RepeatedField<int> *)in_stack_ffffffffffffe5b0);
        break;
      case TYPE_SFIXED32:
        Reflection::GetRepeatedField<int>
                  (in_stack_ffffffffffffe5b0,
                   (Message *)CONCAT44(in_stack_ffffffffffffe5ac,in_stack_ffffffffffffe5a8),
                   (FieldDescriptor *)0x46d09e);
        RepeatedField<int>::RepeatedField
                  ((RepeatedField<int> *)in_stack_ffffffffffffe5c0,
                   (RepeatedField<int> *)in_stack_ffffffffffffe5b8);
        local_be4 = FieldDescriptor::number(local_e90);
        local_be0 = local_ea8;
        local_bf0 = &local_1040;
        local_bf8 = local_ea0;
        io::EpsCopyOutputStream::EnsureSpace
                  ((EpsCopyOutputStream *)in_stack_ffffffffffffe5b0,
                   (uint8 **)CONCAT44(in_stack_ffffffffffffe5ac,in_stack_ffffffffffffe5a8));
        local_c00 = 4;
        iVar8 = RepeatedField<int>::size(local_bf0);
        local_c08 = (long)iVar8 << 2;
        local_5e8 = local_ea8;
        local_5ec = local_be4;
        local_5f0 = (uint)local_c08;
        local_540 = local_ea8;
        local_544 = local_be4;
        local_548 = 2;
        local_550 = local_bf8;
        local_52c = local_be4 << 3 | 2;
        local_538 = local_bf8;
        if (local_52c < 0x80) {
          *(byte *)&local_bf8->descriptor_ = (byte)local_52c;
          local_528 = (Reflection *)((long)&local_bf8->descriptor_ + 1);
        }
        else {
          *(byte *)&local_bf8->descriptor_ = (byte)local_52c | 0x80;
          local_52c = (uint)(local_be4 << 3) >> 7;
          if (local_52c < 0x80) {
            *(byte *)((long)&local_bf8->descriptor_ + 1) = (byte)local_52c;
            local_528 = (Reflection *)((long)&local_bf8->descriptor_ + 2);
          }
          else {
            pRVar18 = (Reflection *)((long)&local_bf8->descriptor_ + 1);
            do {
              local_538 = pRVar18;
              *(byte *)local_538 = (byte)local_52c | 0x80;
              local_52c = local_52c >> 7;
              pRVar18 = (Reflection *)((long)local_538 + 1);
            } while (0x7f < local_52c);
            local_538 = (Reflection *)((long)local_538 + 2);
            *(byte *)pRVar18 = (byte)local_52c;
            local_528 = local_538;
          }
        }
        local_5f8 = local_528;
        local_3e0 = local_528;
        for (local_3d4 = local_5f0; 0x7f < local_3d4; local_3d4 = local_3d4 >> 7) {
          *(byte *)&local_3e0->descriptor_ = (byte)local_3d4 | 0x80;
          local_3e0 = (Reflection *)((long)&local_3e0->descriptor_ + 1);
        }
        local_bf8 = (Reflection *)((long)&local_3e0->descriptor_ + 1);
        *(byte *)&local_3e0->descriptor_ = (byte)local_3d4;
        local_3e0 = local_bf8;
        RepeatedField<int>::data((RepeatedField<int> *)0x46d41e);
        local_ea0 = (Reflection *)
                    io::EpsCopyOutputStream::WriteRawLittleEndian<4>
                              ((EpsCopyOutputStream *)in_stack_ffffffffffffe5c0,
                               in_stack_ffffffffffffe5b8,
                               (int)((ulong)in_stack_ffffffffffffe5b0 >> 0x20),
                               (uint8 *)CONCAT44(in_stack_ffffffffffffe5ac,in_stack_ffffffffffffe5a8
                                                ));
        local_f9c = 8;
        RepeatedField<int>::~RepeatedField((RepeatedField<int> *)in_stack_ffffffffffffe5b0);
        break;
      case TYPE_SFIXED64:
        Reflection::GetRepeatedField<long>
                  (in_stack_ffffffffffffe5b0,
                   (Message *)CONCAT44(in_stack_ffffffffffffe5ac,in_stack_ffffffffffffe5a8),
                   (FieldDescriptor *)0x46d4c8);
        RepeatedField<long>::RepeatedField
                  ((RepeatedField<long> *)in_stack_ffffffffffffe5c0,
                   (RepeatedField<long> *)in_stack_ffffffffffffe5b8);
        local_bb4 = FieldDescriptor::number(local_e90);
        local_bb0 = local_ea8;
        local_bc0 = &local_1050;
        local_bc8 = local_ea0;
        io::EpsCopyOutputStream::EnsureSpace
                  ((EpsCopyOutputStream *)in_stack_ffffffffffffe5b0,
                   (uint8 **)CONCAT44(in_stack_ffffffffffffe5ac,in_stack_ffffffffffffe5a8));
        local_bd0 = 8;
        iVar8 = RepeatedField<long>::size(local_bc0);
        local_bd8 = (long)iVar8 << 3;
        local_600 = local_ea8;
        local_604 = local_bb4;
        local_608 = (uint)local_bd8;
        local_510 = local_ea8;
        local_514 = local_bb4;
        local_518 = 2;
        local_520 = local_bc8;
        local_4fc = local_bb4 << 3 | 2;
        local_508 = local_bc8;
        if (local_4fc < 0x80) {
          *(byte *)&local_bc8->descriptor_ = (byte)local_4fc;
          local_4f8 = (Reflection *)((long)&local_bc8->descriptor_ + 1);
        }
        else {
          *(byte *)&local_bc8->descriptor_ = (byte)local_4fc | 0x80;
          local_4fc = (uint)(local_bb4 << 3) >> 7;
          if (local_4fc < 0x80) {
            *(byte *)((long)&local_bc8->descriptor_ + 1) = (byte)local_4fc;
            local_4f8 = (Reflection *)((long)&local_bc8->descriptor_ + 2);
          }
          else {
            pRVar18 = (Reflection *)((long)&local_bc8->descriptor_ + 1);
            do {
              local_508 = pRVar18;
              *(byte *)local_508 = (byte)local_4fc | 0x80;
              local_4fc = local_4fc >> 7;
              pRVar18 = (Reflection *)((long)local_508 + 1);
            } while (0x7f < local_4fc);
            local_508 = (Reflection *)((long)local_508 + 2);
            *(byte *)pRVar18 = (byte)local_4fc;
            local_4f8 = local_508;
          }
        }
        local_610 = local_4f8;
        local_3d0 = local_4f8;
        for (local_3c4 = local_608; 0x7f < local_3c4; local_3c4 = local_3c4 >> 7) {
          *(byte *)&local_3d0->descriptor_ = (byte)local_3c4 | 0x80;
          local_3d0 = (Reflection *)((long)&local_3d0->descriptor_ + 1);
        }
        local_bc8 = (Reflection *)((long)&local_3d0->descriptor_ + 1);
        *(byte *)&local_3d0->descriptor_ = (byte)local_3c4;
        local_3d0 = local_bc8;
        RepeatedField<long>::data((RepeatedField<long> *)0x46d848);
        local_ea0 = (Reflection *)
                    io::EpsCopyOutputStream::WriteRawLittleEndian<8>
                              ((EpsCopyOutputStream *)in_stack_ffffffffffffe5c0,
                               in_stack_ffffffffffffe5b8,
                               (int)((ulong)in_stack_ffffffffffffe5b0 >> 0x20),
                               (uint8 *)CONCAT44(in_stack_ffffffffffffe5ac,in_stack_ffffffffffffe5a8
                                                ));
        local_f9c = 8;
        RepeatedField<long>::~RepeatedField((RepeatedField<long> *)in_stack_ffffffffffffe5b0);
        break;
      case TYPE_SINT32:
        Reflection::GetRepeatedField<int>
                  (in_stack_ffffffffffffe5b0,
                   (Message *)CONCAT44(in_stack_ffffffffffffe5ac,in_stack_ffffffffffffe5a8),
                   (FieldDescriptor *)0x46a897);
        RepeatedField<int>::RepeatedField
                  ((RepeatedField<int> *)in_stack_ffffffffffffe5c0,
                   (RepeatedField<int> *)in_stack_ffffffffffffe5b8);
        iVar8 = FieldDescriptor::number(local_e90);
        sVar12 = FieldDataOnlyByteSize(in_stack_ffffffffffffe738,in_stack_ffffffffffffe730);
        local_d10 = local_ea8;
        local_d20 = &local_fd0;
        local_d24 = (uint)sVar12;
        local_d30 = local_ea0;
        local_288 = local_ea8;
        local_2a8 = local_ea0;
        local_2b0 = io::EpsCopyOutputStream::ZigZagEncode32;
        local_d14 = iVar8;
        local_29c = local_d24;
        local_298 = local_d20;
        local_28c = iVar8;
        io::EpsCopyOutputStream::EnsureSpace
                  ((EpsCopyOutputStream *)in_stack_ffffffffffffe5b0,
                   (uint8 **)CONCAT44(in_stack_ffffffffffffe5ac,in_stack_ffffffffffffe5a8));
        local_258 = local_ea8;
        local_25c = local_28c;
        local_260 = local_29c;
        local_240 = local_ea8;
        local_244 = local_28c;
        local_248 = 2;
        local_250 = local_2a8;
        local_22c = local_28c << 3 | 2;
        local_238 = local_2a8;
        if (local_22c < 0x80) {
          *(byte *)&local_2a8->descriptor_ = (byte)local_22c;
          local_228 = (Reflection *)((long)&local_2a8->descriptor_ + 1);
        }
        else {
          *(byte *)&local_2a8->descriptor_ = (byte)local_22c | 0x80;
          local_22c = (uint)(local_28c << 3) >> 7;
          if (local_22c < 0x80) {
            *(byte *)((long)&local_2a8->descriptor_ + 1) = (byte)local_22c;
            local_228 = (Reflection *)((long)&local_2a8->descriptor_ + 2);
          }
          else {
            pRVar18 = (Reflection *)((long)&local_2a8->descriptor_ + 1);
            do {
              local_238 = pRVar18;
              *(byte *)local_238 = (byte)local_22c | 0x80;
              local_22c = local_22c >> 7;
              pRVar18 = (Reflection *)((long)local_238 + 1);
            } while (0x7f < local_22c);
            local_238 = (Reflection *)((long)local_238 + 2);
            *(byte *)pRVar18 = (byte)local_22c;
            local_228 = local_238;
          }
        }
        local_268 = local_228;
        local_220 = local_228;
        for (local_214 = local_29c; 0x7f < local_214; local_214 = local_214 >> 7) {
          *(byte *)&local_220->descriptor_ = (byte)local_214 | 0x80;
          local_220 = (Reflection *)((long)&local_220->descriptor_ + 1);
        }
        local_2a8 = (Reflection *)((long)&local_220->descriptor_ + 1);
        *(byte *)&local_220->descriptor_ = (byte)local_214;
        local_220 = local_2a8;
        piVar11 = RepeatedField<int>::data((RepeatedField<int> *)0x46ac45);
        local_2b8 = piVar11;
        iVar8 = RepeatedField<int>::size(local_298);
        local_2c0 = piVar11 + iVar8;
        do {
          io::EpsCopyOutputStream::EnsureSpace
                    ((EpsCopyOutputStream *)in_stack_ffffffffffffe5b0,
                     (uint8 **)CONCAT44(in_stack_ffffffffffffe5ac,in_stack_ffffffffffffe5a8));
          iVar8 = *local_2b8;
          local_2b8 = local_2b8 + 1;
          local_274 = (*local_2b0)(iVar8);
          local_280 = local_2a8;
          if (local_274 < 0x80) {
            *(byte *)&local_2a8->descriptor_ = (byte)local_274;
            local_270 = (Reflection *)((long)&local_2a8->descriptor_ + 1);
          }
          else {
            *(byte *)&local_2a8->descriptor_ = (byte)local_274 | 0x80;
            local_274 = local_274 >> 7;
            if (local_274 < 0x80) {
              *(byte *)((long)&local_2a8->descriptor_ + 1) = (byte)local_274;
              local_270 = (Reflection *)((long)&local_2a8->descriptor_ + 2);
            }
            else {
              pRVar18 = (Reflection *)((long)&local_2a8->descriptor_ + 1);
              do {
                local_280 = pRVar18;
                *(byte *)local_280 = (byte)local_274 | 0x80;
                local_274 = local_274 >> 7;
                pRVar18 = (Reflection *)((long)local_280 + 1);
              } while (0x7f < local_274);
              local_280 = (Reflection *)((long)local_280 + 2);
              *(byte *)pRVar18 = (byte)local_274;
              local_270 = local_280;
            }
          }
          local_2a8 = local_270;
        } while (local_2b8 < local_2c0);
        local_ea0 = local_270;
        local_f9c = 8;
        RepeatedField<int>::~RepeatedField((RepeatedField<int> *)in_stack_ffffffffffffe5b0);
        break;
      case MAX_TYPE:
        Reflection::GetRepeatedField<long>
                  (in_stack_ffffffffffffe5b0,
                   (Message *)CONCAT44(in_stack_ffffffffffffe5ac,in_stack_ffffffffffffe5a8),
                   (FieldDescriptor *)0x46aedb);
        RepeatedField<long>::RepeatedField
                  ((RepeatedField<long> *)in_stack_ffffffffffffe5c0,
                   (RepeatedField<long> *)in_stack_ffffffffffffe5b8);
        iVar8 = FieldDescriptor::number(local_e90);
        sVar12 = FieldDataOnlyByteSize(in_stack_ffffffffffffe738,in_stack_ffffffffffffe730);
        local_ce8 = local_ea8;
        local_cf8 = &local_fe0;
        local_cfc = (uint)sVar12;
        local_d08 = local_ea0;
        local_1d8 = local_ea8;
        local_1f8 = local_ea0;
        local_200 = io::EpsCopyOutputStream::ZigZagEncode64;
        local_cec = iVar8;
        local_1ec = local_cfc;
        local_1e8 = local_cf8;
        local_1dc = iVar8;
        io::EpsCopyOutputStream::EnsureSpace
                  ((EpsCopyOutputStream *)in_stack_ffffffffffffe5b0,
                   (uint8 **)CONCAT44(in_stack_ffffffffffffe5ac,in_stack_ffffffffffffe5a8));
        local_1a8 = local_ea8;
        local_1ac = local_1dc;
        local_1b0 = local_1ec;
        local_190 = local_ea8;
        local_194 = local_1dc;
        local_198 = 2;
        local_1a0 = local_1f8;
        local_17c = local_1dc << 3 | 2;
        local_188 = local_1f8;
        if (local_17c < 0x80) {
          *(byte *)&local_1f8->descriptor_ = (byte)local_17c;
          local_178 = (Reflection *)((long)&local_1f8->descriptor_ + 1);
        }
        else {
          *(byte *)&local_1f8->descriptor_ = (byte)local_17c | 0x80;
          local_17c = (uint)(local_1dc << 3) >> 7;
          if (local_17c < 0x80) {
            *(byte *)((long)&local_1f8->descriptor_ + 1) = (byte)local_17c;
            local_178 = (Reflection *)((long)&local_1f8->descriptor_ + 2);
          }
          else {
            pRVar18 = (Reflection *)((long)&local_1f8->descriptor_ + 1);
            do {
              local_188 = pRVar18;
              *(byte *)local_188 = (byte)local_17c | 0x80;
              local_17c = local_17c >> 7;
              pRVar18 = (Reflection *)((long)local_188 + 1);
            } while (0x7f < local_17c);
            local_188 = (Reflection *)((long)local_188 + 2);
            *(byte *)pRVar18 = (byte)local_17c;
            local_178 = local_188;
          }
        }
        local_1b8 = local_178;
        local_170 = local_178;
        for (local_164 = local_1ec; 0x7f < local_164; local_164 = local_164 >> 7) {
          *(byte *)&local_170->descriptor_ = (byte)local_164 | 0x80;
          local_170 = (Reflection *)((long)&local_170->descriptor_ + 1);
        }
        local_1f8 = (Reflection *)((long)&local_170->descriptor_ + 1);
        *(byte *)&local_170->descriptor_ = (byte)local_164;
        local_170 = local_1f8;
        plVar13 = RepeatedField<long>::data((RepeatedField<long> *)0x46b289);
        local_208 = plVar13;
        iVar8 = RepeatedField<long>::size(local_1e8);
        local_210 = plVar13 + iVar8;
        do {
          io::EpsCopyOutputStream::EnsureSpace
                    ((EpsCopyOutputStream *)in_stack_ffffffffffffe5b0,
                     (uint8 **)CONCAT44(in_stack_ffffffffffffe5ac,in_stack_ffffffffffffe5a8));
          lVar2 = *local_208;
          local_208 = local_208 + 1;
          local_1c8 = (*local_200)(lVar2);
          local_1d0 = local_1f8;
          if (local_1c8 < 0x80) {
            *(byte *)&local_1f8->descriptor_ = (byte)local_1c8;
            local_1c0 = (Reflection *)((long)&local_1f8->descriptor_ + 1);
          }
          else {
            *(byte *)&local_1f8->descriptor_ = (byte)local_1c8 | 0x80;
            local_1c8 = local_1c8 >> 7;
            if (local_1c8 < 0x80) {
              *(byte *)((long)&local_1f8->descriptor_ + 1) = (byte)local_1c8;
              local_1c0 = (Reflection *)((long)&local_1f8->descriptor_ + 2);
            }
            else {
              pRVar18 = (Reflection *)((long)&local_1f8->descriptor_ + 1);
              do {
                local_1d0 = pRVar18;
                *(byte *)local_1d0 = (byte)local_1c8 | 0x80;
                local_1c8 = local_1c8 >> 7;
                pRVar18 = (Reflection *)((long)local_1d0 + 1);
              } while (0x7f < local_1c8);
              local_1d0 = (Reflection *)((long)local_1d0 + 2);
              *(byte *)pRVar18 = (byte)local_1c8;
              local_1c0 = local_1d0;
            }
          }
          local_1f8 = local_1c0;
        } while (local_208 < local_210);
        local_ea0 = local_1c0;
        local_f9c = 8;
        RepeatedField<long>::~RepeatedField((RepeatedField<long> *)in_stack_ffffffffffffe5b0);
      }
      local_e88 = local_ea0;
    }
  }
  else {
    for (local_10c0 = 0; local_10c0 < local_f64; local_10c0 = local_10c0 + 1) {
      io::EpsCopyOutputStream::EnsureSpace
                ((EpsCopyOutputStream *)in_stack_ffffffffffffe5b0,
                 (uint8 **)CONCAT44(in_stack_ffffffffffffe5ac,in_stack_ffffffffffffe5a8));
      TVar6 = FieldDescriptor::type((FieldDescriptor *)in_stack_ffffffffffffe5c0);
      switch(TVar6) {
      case TYPE_DOUBLE:
        bVar4 = FieldDescriptor::is_repeated((FieldDescriptor *)0x46fa13);
        if (bVar4) {
          local_1868 = Reflection::GetRepeatedDouble
                                 (in_stack_ffffffffffffe5c8,(Message *)in_stack_ffffffffffffe5c0,
                                  (FieldDescriptor *)in_stack_ffffffffffffe5b8,
                                  (int)((ulong)in_stack_ffffffffffffe5b0 >> 0x20));
        }
        else {
          local_1868 = Reflection::GetDouble
                                 (in_stack_ffffffffffffe5c8,(Message *)in_stack_ffffffffffffe5c0,
                                  (FieldDescriptor *)in_stack_ffffffffffffe5b8);
        }
        local_1120 = local_1868;
        local_96c = FieldDescriptor::number(local_e90);
        local_978 = local_1120;
        local_980 = local_ea0;
        local_960 = 1;
        local_968 = local_ea0;
        local_95c = local_96c;
        local_94c = WireFormatLite::MakeTag(local_96c,WIRETYPE_FIXED64);
        local_958 = local_968;
        local_980 = (Reflection *)
                    io::CodedOutputStream::WriteVarint32ToArray(local_94c,(uint8 *)local_968);
        local_760 = local_978;
        local_768 = (uint8 *)local_980;
        uVar16 = WireFormatLite::EncodeDouble(local_978);
        local_ea0 = (Reflection *)
                    io::CodedOutputStream::WriteLittleEndian64ToArray(uVar16,local_768);
        break;
      case TYPE_FLOAT:
        bVar4 = FieldDescriptor::is_repeated((FieldDescriptor *)0x46f838);
        if (bVar4) {
          local_1834 = Reflection::GetRepeatedFloat
                                 (in_stack_ffffffffffffe5c8,(Message *)in_stack_ffffffffffffe5c0,
                                  (FieldDescriptor *)in_stack_ffffffffffffe5b8,
                                  (int)((ulong)in_stack_ffffffffffffe5b0 >> 0x20));
        }
        else {
          local_1834 = Reflection::GetFloat
                                 (in_stack_ffffffffffffe5c8,(Message *)in_stack_ffffffffffffe5c0,
                                  (FieldDescriptor *)in_stack_ffffffffffffe5b8);
        }
        local_1114 = local_1834;
        local_9a4 = FieldDescriptor::number(local_e90);
        local_9a8 = local_1114;
        local_9b0 = local_ea0;
        local_998 = 5;
        local_9a0 = local_ea0;
        local_994 = local_9a4;
        local_984 = WireFormatLite::MakeTag(local_9a4,WIRETYPE_FIXED32);
        local_990 = local_9a0;
        local_9b0 = (Reflection *)
                    io::CodedOutputStream::WriteVarint32ToArray(local_984,(uint8 *)local_9a0);
        local_76c = local_9a8;
        local_778 = (uint8 *)local_9b0;
        uVar7 = WireFormatLite::EncodeFloat(local_9a8);
        local_ea0 = (Reflection *)io::CodedOutputStream::WriteLittleEndian32ToArray(uVar7,local_778)
        ;
        break;
      case TYPE_INT64:
        bVar4 = FieldDescriptor::is_repeated((FieldDescriptor *)0x46e842);
        if (bVar4) {
          local_1688 = Reflection::GetRepeatedInt64
                                 (in_stack_ffffffffffffe5c8,(Message *)in_stack_ffffffffffffe5c0,
                                  (FieldDescriptor *)in_stack_ffffffffffffe5b8,
                                  (int)((ulong)in_stack_ffffffffffffe5b0 >> 0x20));
        }
        else {
          local_1688 = Reflection::GetInt64
                                 (in_stack_ffffffffffffe5c8,(Message *)in_stack_ffffffffffffe5c0,
                                  (FieldDescriptor *)in_stack_ffffffffffffe5b8);
        }
        local_10d0 = local_1688;
        local_ad4 = FieldDescriptor::number(local_e90);
        local_ae0 = local_10d0;
        local_ae8 = local_ea0;
        local_ac8 = 0;
        local_ad0 = local_ea0;
        local_ac4 = local_ad4;
        local_ab4 = WireFormatLite::MakeTag(local_ad4,WIRETYPE_VARINT);
        local_ac0 = local_ad0;
        local_ae8 = (Reflection *)
                    io::CodedOutputStream::WriteVarint32ToArray(local_ab4,(uint8 *)local_ad0);
        local_7d0 = local_ae0;
        local_7d8 = (uint8 *)local_ae8;
        local_ea0 = (Reflection *)
                    io::CodedOutputStream::WriteVarint64ToArray(local_ae0,(uint8 *)local_ae8);
        break;
      case TYPE_UINT64:
        bVar4 = FieldDescriptor::is_repeated((FieldDescriptor *)0x46ef63);
        if (bVar4) {
          local_1748 = Reflection::GetRepeatedUInt64
                                 (in_stack_ffffffffffffe5c8,(Message *)in_stack_ffffffffffffe5c0,
                                  (FieldDescriptor *)in_stack_ffffffffffffe5b8,
                                  (int)((ulong)in_stack_ffffffffffffe5b0 >> 0x20));
        }
        else {
          local_1748 = Reflection::GetUInt64
                                 (in_stack_ffffffffffffe5c8,(Message *)in_stack_ffffffffffffe5c0,
                                  (FieldDescriptor *)in_stack_ffffffffffffe5b8);
        }
        local_10f0 = local_1748;
        local_e6c = FieldDescriptor::number(local_e90);
        local_e78 = local_10f0;
        local_e80 = local_ea0;
        local_db8 = 0;
        local_dc0 = local_ea0;
        local_db4 = local_e6c;
        local_da4 = WireFormatLite::MakeTag(local_e6c,WIRETYPE_VARINT);
        local_db0 = local_dc0;
        local_e80 = (Reflection *)
                    io::CodedOutputStream::WriteVarint32ToArray(local_da4,(uint8 *)local_dc0);
        local_840 = local_e78;
        local_848 = (uint8 *)local_e80;
        local_ea0 = (Reflection *)
                    io::CodedOutputStream::WriteVarint64ToArray(local_e78,(uint8 *)local_e80);
        break;
      case TYPE_INT32:
        bVar4 = FieldDescriptor::is_repeated((FieldDescriptor *)0x46e684);
        if (bVar4) {
          local_1654 = Reflection::GetRepeatedInt32
                                 (in_stack_ffffffffffffe5c8,(Message *)in_stack_ffffffffffffe5c0,
                                  (FieldDescriptor *)in_stack_ffffffffffffe5b8,
                                  (int)((ulong)in_stack_ffffffffffffe5b0 >> 0x20));
        }
        else {
          local_1654 = Reflection::GetInt32
                                 (in_stack_ffffffffffffe5c8,(Message *)in_stack_ffffffffffffe5c0,
                                  (FieldDescriptor *)in_stack_ffffffffffffe5b8);
        }
        local_10c4 = local_1654;
        local_b0c = FieldDescriptor::number(local_e90);
        local_b10 = local_10c4;
        local_b18 = local_ea0;
        local_b00 = 0;
        local_b08 = local_ea0;
        local_afc = local_b0c;
        local_aec = WireFormatLite::MakeTag(local_b0c,WIRETYPE_VARINT);
        local_af8 = local_b08;
        local_b18 = (Reflection *)
                    io::CodedOutputStream::WriteVarint32ToArray(local_aec,(uint8 *)local_b08);
        local_7dc = local_b10;
        local_7e8 = (uint8 *)local_b18;
        local_ea0 = (Reflection *)
                    io::CodedOutputStream::WriteVarint32SignExtendedToArray
                              ((int32)((ulong)in_stack_ffffffffffffe5b0 >> 0x20),
                               (uint8 *)CONCAT44(in_stack_ffffffffffffe5ac,in_stack_ffffffffffffe5a8
                                                ));
        break;
      case TYPE_FIXED64:
        bVar4 = FieldDescriptor::is_repeated((FieldDescriptor *)0x46f2f0);
        if (bVar4) {
          local_17a8 = Reflection::GetRepeatedUInt64
                                 (in_stack_ffffffffffffe5c8,(Message *)in_stack_ffffffffffffe5c0,
                                  (FieldDescriptor *)in_stack_ffffffffffffe5b8,
                                  (int)((ulong)in_stack_ffffffffffffe5b0 >> 0x20));
        }
        else {
          local_17a8 = Reflection::GetUInt64
                                 (in_stack_ffffffffffffe5c8,(Message *)in_stack_ffffffffffffe5c0,
                                  (FieldDescriptor *)in_stack_ffffffffffffe5b8);
        }
        local_1100 = local_17a8;
        local_e44 = FieldDescriptor::number(local_e90);
        local_e50 = local_1100;
        local_e58 = local_ea0;
        local_dd8 = 1;
        local_de0 = local_ea0;
        local_dd4 = local_e44;
        local_d84 = WireFormatLite::MakeTag(local_e44,WIRETYPE_FIXED64);
        local_d90 = local_de0;
        local_e58 = (Reflection *)
                    io::CodedOutputStream::WriteVarint32ToArray(local_d84,(uint8 *)local_de0);
        local_820 = local_e50;
        local_828 = (uint8 *)local_e58;
        local_ea0 = (Reflection *)
                    io::CodedOutputStream::WriteLittleEndian64ToArray(local_e50,(uint8 *)local_e58);
        break;
      case TYPE_FIXED32:
        bVar4 = FieldDescriptor::is_repeated((FieldDescriptor *)0x46f132);
        if (bVar4) {
          local_1774 = Reflection::GetRepeatedUInt32
                                 (in_stack_ffffffffffffe5c8,(Message *)in_stack_ffffffffffffe5c0,
                                  (FieldDescriptor *)in_stack_ffffffffffffe5b8,
                                  (int)((ulong)in_stack_ffffffffffffe5b0 >> 0x20));
        }
        else {
          local_1774 = Reflection::GetUInt32
                                 (in_stack_ffffffffffffe5c8,(Message *)in_stack_ffffffffffffe5c0,
                                  (FieldDescriptor *)in_stack_ffffffffffffe5b8);
        }
        local_10f4 = local_1774;
        local_e5c = FieldDescriptor::number(local_e90);
        local_e60 = local_10f4;
        local_e68 = local_ea0;
        local_dc8 = 5;
        local_dd0 = local_ea0;
        local_dc4 = local_e5c;
        local_d94 = WireFormatLite::MakeTag(local_e5c,WIRETYPE_FIXED32);
        local_da0 = local_dd0;
        local_e68 = (Reflection *)
                    io::CodedOutputStream::WriteVarint32ToArray(local_d94,(uint8 *)local_dd0);
        local_82c = local_e60;
        local_838 = (uint8 *)local_e68;
        local_ea0 = (Reflection *)
                    io::CodedOutputStream::WriteLittleEndian32ToArray(local_e60,(uint8 *)local_e68);
        break;
      case TYPE_BOOL:
        bVar4 = FieldDescriptor::is_repeated((FieldDescriptor *)0x46fbef);
        if (bVar4) {
          local_188b = Reflection::GetRepeatedBool
                                 (in_stack_ffffffffffffe5c8,(Message *)in_stack_ffffffffffffe5c0,
                                  (FieldDescriptor *)in_stack_ffffffffffffe5b8,
                                  (int)((ulong)in_stack_ffffffffffffe5b0 >> 0x20));
        }
        else {
          local_188b = Reflection::GetBool(in_stack_ffffffffffffe5c8,
                                           (Message *)in_stack_ffffffffffffe5c0,
                                           (FieldDescriptor *)in_stack_ffffffffffffe5b8);
        }
        local_1121 = local_188b;
        local_93c = FieldDescriptor::number(local_e90);
        local_93d = local_1121 & 1;
        local_948 = local_ea0;
        local_930 = 0;
        local_938 = local_ea0;
        local_92c = local_93c;
        local_91c = WireFormatLite::MakeTag(local_93c,WIRETYPE_VARINT);
        local_928 = local_938;
        local_948 = (Reflection *)
                    io::CodedOutputStream::WriteVarint32ToArray(local_91c,(uint8 *)local_938);
        local_749 = local_93d & 1;
        local_758 = (uint8 *)local_948;
        local_ea0 = (Reflection *)
                    io::CodedOutputStream::WriteVarint32ToArray((uint)local_749,(uint8 *)local_948);
        break;
      case TYPE_STRING:
        local_1131 = StrictUtf8Check((FieldDescriptor *)0x470479);
        std::__cxx11::string::string(local_1158);
        bVar4 = FieldDescriptor::is_repeated((FieldDescriptor *)0x4704ac);
        if (bVar4) {
          local_1978 = Reflection::GetRepeatedStringReference
                                 ((Reflection *)
                                  CONCAT17(in_stack_ffffffffffffe5df,in_stack_ffffffffffffe5d8),
                                  (Message *)in_stack_ffffffffffffe5d0,
                                  (FieldDescriptor *)in_stack_ffffffffffffe5c8,
                                  (int)((ulong)in_stack_ffffffffffffe5c0 >> 0x20),
                                  (string *)in_stack_ffffffffffffe5b8);
        }
        else {
          local_1978 = Reflection::GetStringReference
                                 (in_stack_ffffffffffffe5d0,(Message *)in_stack_ffffffffffffe5c8,
                                  (FieldDescriptor *)in_stack_ffffffffffffe5c0,
                                  (string *)in_stack_ffffffffffffe5b8);
        }
        local_1160 = local_1978;
        if ((local_1131 & 1) == 0) {
          std::__cxx11::string::data();
          std::__cxx11::string::length();
          FieldDescriptor::full_name_abi_cxx11_(local_e90);
          std::__cxx11::string::c_str();
          VerifyUTF8StringNamedField
                    ((char *)in_stack_ffffffffffffe5b0,in_stack_ffffffffffffe5ac,
                     in_stack_ffffffffffffe5a8,(char *)0x470668);
        }
        else {
          std::__cxx11::string::data();
          std::__cxx11::string::length();
          FieldDescriptor::full_name_abi_cxx11_(local_e90);
          std::__cxx11::string::c_str();
          WireFormatLite::VerifyUtf8String
                    ((char *)in_stack_ffffffffffffe5c8,
                     (int)((ulong)in_stack_ffffffffffffe5c0 >> 0x20),
                     (Operation)in_stack_ffffffffffffe5c0,(char *)in_stack_ffffffffffffe5b8);
        }
        pRVar18 = local_ea8;
        local_df4 = FieldDescriptor::number(local_e90);
        local_df0 = pRVar18;
        local_e00 = local_1160;
        local_e08 = local_ea0;
        local_e10 = std::__cxx11::string::size();
        bVar4 = true;
        if ((long)local_e10 < 0x80) {
          pDVar10 = pRVar18->descriptor_ + (0x10 - (long)local_e08);
          iVar8 = io::EpsCopyOutputStream::TagSize(local_df4 << 3);
          bVar4 = (long)(pDVar10 + (-1 - (long)iVar8)) < (long)local_e10;
        }
        if (bVar4) {
          local_de8 = (Reflection *)
                      io::EpsCopyOutputStream::WriteStringOutline
                                ((EpsCopyOutputStream *)in_stack_ffffffffffffe5c8,
                                 (uint32)((ulong)in_stack_ffffffffffffe5c0 >> 0x20),
                                 (string *)in_stack_ffffffffffffe5b8,
                                 (uint8 *)in_stack_ffffffffffffe5b0);
        }
        else {
          local_80c = local_df4 << 3 | 2;
          local_818 = local_e08;
          if (local_80c < 0x80) {
            *(byte *)&local_e08->descriptor_ = (byte)local_80c;
            local_808 = (Reflection *)((long)&local_e08->descriptor_ + 1);
          }
          else {
            *(byte *)&local_e08->descriptor_ = (byte)local_80c | 0x80;
            local_80c = (uint)(local_df4 << 3) >> 7;
            if (local_80c < 0x80) {
              *(byte *)((long)&local_e08->descriptor_ + 1) = (byte)local_80c;
              local_808 = (Reflection *)((long)&local_e08->descriptor_ + 2);
            }
            else {
              pRVar18 = (Reflection *)((long)&local_e08->descriptor_ + 1);
              do {
                local_818 = pRVar18;
                *(byte *)local_818 = (byte)local_80c | 0x80;
                local_80c = local_80c >> 7;
                pRVar18 = (Reflection *)((long)local_818 + 1);
              } while (0x7f < local_80c);
              local_818 = (Reflection *)((long)local_818 + 2);
              *(byte *)pRVar18 = (byte)local_80c;
              local_808 = local_818;
            }
          }
          pRVar18 = (Reflection *)((long)&local_808->descriptor_ + 1);
          *(byte *)&local_808->descriptor_ = (byte)local_e10;
          local_e08 = pRVar18;
          pvVar19 = (void *)std::__cxx11::string::data();
          memcpy(pRVar18,pvVar19,local_e10);
          local_de8 = (Reflection *)((long)&local_e08->descriptor_ + local_e10);
        }
        local_ea0 = local_de8;
        local_f9c = 0xc;
        std::__cxx11::string::~string(local_1158);
        break;
      case TYPE_GROUP:
        iVar8 = FieldDescriptor::number(local_e90);
        bVar4 = FieldDescriptor::is_repeated((FieldDescriptor *)0x46fdcf);
        if (bVar4) {
          bVar4 = std::
                  vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                  ::empty((vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                           *)in_stack_ffffffffffffe5c0);
          if (bVar4) {
            local_18b8 = Reflection::GetRepeatedMessage
                                   (in_stack_ffffffffffffe5c8,(Message *)in_stack_ffffffffffffe5c0,
                                    (FieldDescriptor *)in_stack_ffffffffffffe5b8,
                                    (int)((ulong)in_stack_ffffffffffffe5b0 >> 0x20));
          }
          else {
            ppMVar17 = std::
                       vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                       ::operator[](&local_f80,(long)local_10c0);
            local_18b8 = *ppMVar17;
          }
          local_18c0 = local_18b8;
        }
        else {
          local_18c0 = Reflection::GetMessage
                                 ((Reflection *)
                                  CONCAT17(in_stack_ffffffffffffe5df,in_stack_ffffffffffffe5d8),
                                  (Message *)in_stack_ffffffffffffe5d0,
                                  (FieldDescriptor *)in_stack_ffffffffffffe5c8,
                                  (MessageFactory *)in_stack_ffffffffffffe5c0);
        }
        local_908 = local_18c0;
        local_910 = local_ea0;
        local_918 = local_ea8;
        local_8e0 = 3;
        local_8e8 = local_ea0;
        local_8fc = iVar8;
        local_8dc = iVar8;
        local_8cc = WireFormatLite::MakeTag(iVar8,WIRETYPE_START_GROUP);
        local_8d8 = local_8e8;
        local_910 = (Reflection *)
                    io::CodedOutputStream::WriteVarint32ToArray(local_8cc,(uint8 *)local_8e8);
        iVar8 = (*(local_908->super_MessageLite)._vptr_MessageLite[0xe])
                          (local_908,local_910,local_918);
        local_910 = (Reflection *)CONCAT44(extraout_var,iVar8);
        io::EpsCopyOutputStream::EnsureSpace
                  ((EpsCopyOutputStream *)in_stack_ffffffffffffe5b0,
                   (uint8 **)CONCAT44(in_stack_ffffffffffffe5ac,in_stack_ffffffffffffe5a8));
        local_8ec = local_8fc;
        local_8f0 = 4;
        local_8f8 = (uint8 *)local_910;
        local_8bc = WireFormatLite::MakeTag(local_8fc,WIRETYPE_END_GROUP);
        local_8c8 = local_8f8;
        local_ea0 = (Reflection *)io::CodedOutputStream::WriteVarint32ToArray(local_8bc,local_8f8);
        break;
      case TYPE_MESSAGE:
        iVar8 = FieldDescriptor::number(local_e90);
        bVar4 = FieldDescriptor::is_repeated((FieldDescriptor *)0x47006a);
        if (bVar4) {
          bVar4 = std::
                  vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                  ::empty((vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                           *)in_stack_ffffffffffffe5c0);
          if (bVar4) {
            local_18f8 = Reflection::GetRepeatedMessage
                                   (in_stack_ffffffffffffe5c8,(Message *)in_stack_ffffffffffffe5c0,
                                    (FieldDescriptor *)in_stack_ffffffffffffe5b8,
                                    (int)((ulong)in_stack_ffffffffffffe5b0 >> 0x20));
          }
          else {
            ppMVar17 = std::
                       vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                       ::operator[](&local_f80,(long)local_10c0);
            local_18f8 = *ppMVar17;
          }
          local_1900 = local_18f8;
        }
        else {
          local_1900 = Reflection::GetMessage
                                 ((Reflection *)
                                  CONCAT17(in_stack_ffffffffffffe5df,in_stack_ffffffffffffe5d8),
                                  (Message *)in_stack_ffffffffffffe5d0,
                                  (FieldDescriptor *)in_stack_ffffffffffffe5c8,
                                  (MessageFactory *)in_stack_ffffffffffffe5c0);
        }
        local_8a8 = local_1900;
        local_8b0 = local_ea0;
        local_8b8 = local_ea8;
        local_890 = 2;
        local_898 = local_ea0;
        local_89c = iVar8;
        local_88c = iVar8;
        local_87c = WireFormatLite::MakeTag(iVar8,WIRETYPE_LENGTH_DELIMITED);
        local_888 = local_898;
        local_8b0 = (Reflection *)
                    io::CodedOutputStream::WriteVarint32ToArray(local_87c,(uint8 *)local_898);
        uVar7 = (*(local_8a8->super_MessageLite)._vptr_MessageLite[0xc])();
        local_8b0 = (Reflection *)
                    io::CodedOutputStream::WriteVarint32ToArray(uVar7,(uint8 *)local_8b0);
        iVar8 = (*(local_8a8->super_MessageLite)._vptr_MessageLite[0xe])
                          (local_8a8,local_8b0,local_8b8);
        local_ea0 = (Reflection *)CONCAT44(extraout_var_00,iVar8);
        break;
      case TYPE_BYTES:
        std::__cxx11::string::string(local_1180);
        bVar4 = FieldDescriptor::is_repeated((FieldDescriptor *)0x4709c8);
        if (bVar4) {
          local_1a08 = Reflection::GetRepeatedStringReference
                                 ((Reflection *)
                                  CONCAT17(in_stack_ffffffffffffe5df,in_stack_ffffffffffffe5d8),
                                  (Message *)in_stack_ffffffffffffe5d0,
                                  (FieldDescriptor *)in_stack_ffffffffffffe5c8,
                                  (int)((ulong)in_stack_ffffffffffffe5c0 >> 0x20),
                                  (string *)in_stack_ffffffffffffe5b8);
        }
        else {
          local_1a08 = Reflection::GetStringReference
                                 (in_stack_ffffffffffffe5d0,(Message *)in_stack_ffffffffffffe5c8,
                                  (FieldDescriptor *)in_stack_ffffffffffffe5c0,
                                  (string *)in_stack_ffffffffffffe5b8);
        }
        in_stack_ffffffffffffe5d0 = local_ea8;
        local_e24 = FieldDescriptor::number(local_e90);
        local_e30 = local_1a08;
        local_e38 = local_ea0;
        local_e40 = std::__cxx11::string::size();
        in_stack_ffffffffffffe5df = true;
        if ((long)local_e40 < 0x80) {
          in_stack_ffffffffffffe5c8 =
               (Reflection *)(in_stack_ffffffffffffe5d0->descriptor_ + (0x10 - (long)local_e38));
          iVar8 = io::EpsCopyOutputStream::TagSize(local_e24 << 3);
          in_stack_ffffffffffffe5df =
               (long)in_stack_ffffffffffffe5c8 + (-1 - (long)iVar8) < (long)local_e40;
        }
        if ((bool)in_stack_ffffffffffffe5df == false) {
          local_7f4 = local_e24 << 3 | 2;
          local_800 = local_e38;
          if (local_7f4 < 0x80) {
            *(byte *)&local_e38->descriptor_ = (byte)local_7f4;
            local_7f0 = (Reflection *)((long)&local_e38->descriptor_ + 1);
          }
          else {
            *(byte *)&local_e38->descriptor_ = (byte)local_7f4 | 0x80;
            local_7f4 = (uint)(local_e24 << 3) >> 7;
            if (local_7f4 < 0x80) {
              *(byte *)((long)&local_e38->descriptor_ + 1) = (byte)local_7f4;
              local_7f0 = (Reflection *)((long)&local_e38->descriptor_ + 2);
            }
            else {
              pRVar18 = (Reflection *)((long)&local_e38->descriptor_ + 1);
              do {
                local_800 = pRVar18;
                *(byte *)local_800 = (byte)local_7f4 | 0x80;
                local_7f4 = local_7f4 >> 7;
                pRVar18 = (Reflection *)((long)local_800 + 1);
              } while (0x7f < local_7f4);
              local_800 = (Reflection *)((long)local_800 + 2);
              *(byte *)pRVar18 = (byte)local_7f4;
              local_7f0 = local_800;
            }
          }
          in_stack_ffffffffffffe5b8 = (Reflection *)((long)&local_7f0->descriptor_ + 1);
          *(byte *)&local_7f0->descriptor_ = (byte)local_e40;
          local_e38 = in_stack_ffffffffffffe5b8;
          pvVar19 = (void *)std::__cxx11::string::data();
          memcpy(in_stack_ffffffffffffe5b8,pvVar19,local_e40);
          local_e18 = (Reflection *)((long)&local_e38->descriptor_ + local_e40);
        }
        else {
          in_stack_ffffffffffffe5c0 =
               (Reflection *)
               io::EpsCopyOutputStream::WriteStringOutline
                         ((EpsCopyOutputStream *)in_stack_ffffffffffffe5c8,
                          (uint32)((ulong)in_stack_ffffffffffffe5c0 >> 0x20),
                          (string *)in_stack_ffffffffffffe5b8,(uint8 *)in_stack_ffffffffffffe5b0);
          local_e18 = in_stack_ffffffffffffe5c0;
        }
        local_ea0 = local_e18;
        local_f9c = 0xc;
        in_stack_ffffffffffffe5b0 = local_e18;
        std::__cxx11::string::~string(local_1180);
        break;
      case TYPE_UINT32:
        bVar4 = FieldDescriptor::is_repeated((FieldDescriptor *)0x46eda5);
        if (bVar4) {
          local_1714 = Reflection::GetRepeatedUInt32
                                 (in_stack_ffffffffffffe5c8,(Message *)in_stack_ffffffffffffe5c0,
                                  (FieldDescriptor *)in_stack_ffffffffffffe5b8,
                                  (int)((ulong)in_stack_ffffffffffffe5b0 >> 0x20));
        }
        else {
          local_1714 = Reflection::GetUInt32
                                 (in_stack_ffffffffffffe5c8,(Message *)in_stack_ffffffffffffe5c0,
                                  (FieldDescriptor *)in_stack_ffffffffffffe5b8);
        }
        local_10e4 = local_1714;
        local_a3c = FieldDescriptor::number(local_e90);
        local_a40 = local_10e4;
        local_a48 = local_ea0;
        local_a30 = 0;
        local_a38 = local_ea0;
        local_a2c = local_a3c;
        local_a1c = WireFormatLite::MakeTag(local_a3c,WIRETYPE_VARINT);
        local_a28 = local_a38;
        local_a48 = (Reflection *)
                    io::CodedOutputStream::WriteVarint32ToArray(local_a1c,(uint8 *)local_a38);
        local_79c = local_a40;
        local_7a8 = (uint8 *)local_a48;
        local_ea0 = (Reflection *)
                    io::CodedOutputStream::WriteVarint32ToArray(local_a40,(uint8 *)local_a48);
        break;
      case TYPE_ENUM:
        bVar4 = FieldDescriptor::is_repeated((FieldDescriptor *)0x47029d);
        if (bVar4) {
          local_1130 = Reflection::GetRepeatedEnum
                                 (in_stack_ffffffffffffe5c0,(Message *)in_stack_ffffffffffffe5b8,
                                  (FieldDescriptor *)in_stack_ffffffffffffe5b0,
                                  in_stack_ffffffffffffe5ac);
        }
        else {
          local_1130 = Reflection::GetEnum(in_stack_ffffffffffffe5c0,
                                           (Message *)in_stack_ffffffffffffe5b8,
                                           (FieldDescriptor *)in_stack_ffffffffffffe5b0);
        }
        iVar8 = FieldDescriptor::number(local_e90);
        local_870 = EnumValueDescriptor::number(local_1130);
        local_878 = local_ea0;
        local_860 = 0;
        local_868 = local_ea0;
        local_86c = iVar8;
        local_85c = iVar8;
        local_84c = WireFormatLite::MakeTag(iVar8,WIRETYPE_VARINT);
        local_858 = local_868;
        local_878 = (Reflection *)
                    io::CodedOutputStream::WriteVarint32ToArray(local_84c,(uint8 *)local_868);
        local_73c = local_870;
        local_748 = (uint8 *)local_878;
        local_ea0 = (Reflection *)
                    io::CodedOutputStream::WriteVarint32SignExtendedToArray
                              ((int32)((ulong)in_stack_ffffffffffffe5b0 >> 0x20),
                               (uint8 *)CONCAT44(in_stack_ffffffffffffe5ac,in_stack_ffffffffffffe5a8
                                                ));
        break;
      case TYPE_SFIXED32:
        bVar4 = FieldDescriptor::is_repeated((FieldDescriptor *)0x46f4bb);
        if (bVar4) {
          local_17d4 = Reflection::GetRepeatedInt32
                                 (in_stack_ffffffffffffe5c8,(Message *)in_stack_ffffffffffffe5c0,
                                  (FieldDescriptor *)in_stack_ffffffffffffe5b8,
                                  (int)((ulong)in_stack_ffffffffffffe5b0 >> 0x20));
        }
        else {
          local_17d4 = Reflection::GetInt32
                                 (in_stack_ffffffffffffe5c8,(Message *)in_stack_ffffffffffffe5c0,
                                  (FieldDescriptor *)in_stack_ffffffffffffe5b8);
        }
        local_1104 = local_17d4;
        local_a0c = FieldDescriptor::number(local_e90);
        local_a10 = local_1104;
        local_a18 = local_ea0;
        local_a00 = 5;
        local_a08 = local_ea0;
        local_9fc = local_a0c;
        local_9ec = WireFormatLite::MakeTag(local_a0c,WIRETYPE_FIXED32);
        local_9f8 = local_a08;
        local_a18 = (Reflection *)
                    io::CodedOutputStream::WriteVarint32ToArray(local_9ec,(uint8 *)local_a08);
        local_78c = local_a10;
        local_798 = (uint8 *)local_a18;
        local_ea0 = (Reflection *)
                    io::CodedOutputStream::WriteLittleEndian32ToArray(local_a10,(uint8 *)local_a18);
        break;
      case TYPE_SFIXED64:
        bVar4 = FieldDescriptor::is_repeated((FieldDescriptor *)0x46f673);
        if (bVar4) {
          local_1808 = Reflection::GetRepeatedInt64
                                 (in_stack_ffffffffffffe5c8,(Message *)in_stack_ffffffffffffe5c0,
                                  (FieldDescriptor *)in_stack_ffffffffffffe5b8,
                                  (int)((ulong)in_stack_ffffffffffffe5b0 >> 0x20));
        }
        else {
          local_1808 = Reflection::GetInt64
                                 (in_stack_ffffffffffffe5c8,(Message *)in_stack_ffffffffffffe5c0,
                                  (FieldDescriptor *)in_stack_ffffffffffffe5b8);
        }
        local_1110 = local_1808;
        local_9d4 = FieldDescriptor::number(local_e90);
        local_9e0 = local_1110;
        local_9e8 = local_ea0;
        local_9c8 = 1;
        local_9d0 = local_ea0;
        local_9c4 = local_9d4;
        local_9b4 = WireFormatLite::MakeTag(local_9d4,WIRETYPE_FIXED64);
        local_9c0 = local_9d0;
        local_9e8 = (Reflection *)
                    io::CodedOutputStream::WriteVarint32ToArray(local_9b4,(uint8 *)local_9d0);
        local_780 = local_9e0;
        local_788 = (uint8 *)local_9e8;
        local_ea0 = (Reflection *)
                    io::CodedOutputStream::WriteLittleEndian64ToArray(local_9e0,(uint8 *)local_9e8);
        break;
      case TYPE_SINT32:
        bVar4 = FieldDescriptor::is_repeated((FieldDescriptor *)0x46ea0d);
        if (bVar4) {
          local_16b4 = Reflection::GetRepeatedInt32
                                 (in_stack_ffffffffffffe5c8,(Message *)in_stack_ffffffffffffe5c0,
                                  (FieldDescriptor *)in_stack_ffffffffffffe5b8,
                                  (int)((ulong)in_stack_ffffffffffffe5b0 >> 0x20));
        }
        else {
          local_16b4 = Reflection::GetInt32
                                 (in_stack_ffffffffffffe5c8,(Message *)in_stack_ffffffffffffe5c0,
                                  (FieldDescriptor *)in_stack_ffffffffffffe5b8);
        }
        local_10d4 = local_16b4;
        local_aa4 = FieldDescriptor::number(local_e90);
        local_aa8 = local_10d4;
        local_ab0 = local_ea0;
        local_a98 = 0;
        local_aa0 = local_ea0;
        local_a94 = local_aa4;
        local_a84 = WireFormatLite::MakeTag(local_aa4,WIRETYPE_VARINT);
        local_a90 = local_aa0;
        local_ab0 = (Reflection *)
                    io::CodedOutputStream::WriteVarint32ToArray(local_a84,(uint8 *)local_aa0);
        local_7bc = local_aa8;
        local_7c8 = (uint8 *)local_ab0;
        uVar7 = WireFormatLite::ZigZagEncode32(local_aa8);
        local_ea0 = (Reflection *)io::CodedOutputStream::WriteVarint32ToArray(uVar7,local_7c8);
        break;
      case MAX_TYPE:
        bVar4 = FieldDescriptor::is_repeated((FieldDescriptor *)0x46ebd2);
        if (bVar4) {
          local_16e8 = Reflection::GetRepeatedInt64
                                 (in_stack_ffffffffffffe5c8,(Message *)in_stack_ffffffffffffe5c0,
                                  (FieldDescriptor *)in_stack_ffffffffffffe5b8,
                                  (int)((ulong)in_stack_ffffffffffffe5b0 >> 0x20));
        }
        else {
          local_16e8 = Reflection::GetInt64
                                 (in_stack_ffffffffffffe5c8,(Message *)in_stack_ffffffffffffe5c0,
                                  (FieldDescriptor *)in_stack_ffffffffffffe5b8);
        }
        local_10e0 = local_16e8;
        local_a6c = FieldDescriptor::number(local_e90);
        local_a78 = local_10e0;
        local_a80 = local_ea0;
        local_a60 = 0;
        local_a68 = local_ea0;
        local_a5c = local_a6c;
        local_a4c = WireFormatLite::MakeTag(local_a6c,WIRETYPE_VARINT);
        local_a58 = local_a68;
        local_a80 = (Reflection *)
                    io::CodedOutputStream::WriteVarint32ToArray(local_a4c,(uint8 *)local_a68);
        local_7b0 = local_a78;
        local_7b8 = (uint8 *)local_a80;
        uVar16 = WireFormatLite::ZigZagEncode64(local_a78);
        local_ea0 = (Reflection *)io::CodedOutputStream::WriteVarint64ToArray(uVar16,local_7b8);
      }
    }
    local_e88 = local_ea0;
  }
  local_f9c = 1;
  local_ea0 = local_e88;
  std::vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  ::~vector((vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
             *)in_stack_ffffffffffffe5c0);
  return (uint8 *)local_e88;
}

Assistant:

uint8* WireFormat::InternalSerializeField(const FieldDescriptor* field,
                                          const Message& message, uint8* target,
                                          io::EpsCopyOutputStream* stream) {
  const Reflection* message_reflection = message.GetReflection();

  if (field->is_extension() &&
      field->containing_type()->options().message_set_wire_format() &&
      field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
      !field->is_repeated()) {
    return InternalSerializeMessageSetItem(field, message, target, stream);
  }

  // For map fields, we can use either repeated field reflection or map
  // reflection.  Our choice has some subtle effects.  If we use repeated field
  // reflection here, then the repeated field representation becomes
  // authoritative for this field: any existing references that came from map
  // reflection remain valid for reading, but mutations to them are lost and
  // will be overwritten next time we call map reflection!
  //
  // So far this mainly affects Python, which keeps long-term references to map
  // values around, and always uses map reflection.  See: b/35918691
  //
  // Here we choose to use map reflection API as long as the internal
  // map is valid. In this way, the serialization doesn't change map field's
  // internal state and existing references that came from map reflection remain
  // valid for both reading and writing.
  if (field->is_map()) {
    const MapFieldBase* map_field =
        message_reflection->GetMapData(message, field);
    if (map_field->IsMapValid()) {
      if (stream->IsSerializationDeterministic()) {
        std::vector<MapKey> sorted_key_list =
            MapKeySorter::SortKey(message, message_reflection, field);
        for (std::vector<MapKey>::iterator it = sorted_key_list.begin();
             it != sorted_key_list.end(); ++it) {
          MapValueRef map_value;
          message_reflection->InsertOrLookupMapValue(
              const_cast<Message*>(&message), field, *it, &map_value);
          target =
              InternalSerializeMapEntry(field, *it, map_value, target, stream);
        }
      } else {
        for (MapIterator it = message_reflection->MapBegin(
                 const_cast<Message*>(&message), field);
             it !=
             message_reflection->MapEnd(const_cast<Message*>(&message), field);
             ++it) {
          target = InternalSerializeMapEntry(field, it.GetKey(),
                                             it.GetValueRef(), target, stream);
        }
      }

      return target;
    }
  }
  int count = 0;

  if (field->is_repeated()) {
    count = message_reflection->FieldSize(message, field);
  } else if (field->containing_type()->options().map_entry()) {
    // Map entry fields always need to be serialized.
    count = 1;
  } else if (message_reflection->HasField(message, field)) {
    count = 1;
  }

  // map_entries is for maps that'll be deterministically serialized.
  std::vector<const Message*> map_entries;
  if (count > 1 && field->is_map() && stream->IsSerializationDeterministic()) {
    map_entries =
        DynamicMapSorter::Sort(message, count, message_reflection, field);
  }

  if (field->is_packed()) {
    if (count == 0) return target;
    stream->EnsureSpace(&target);
    switch (field->type()) {
#define HANDLE_PRIMITIVE_TYPE(TYPE, CPPTYPE, TYPE_METHOD, CPPTYPE_METHOD)   \
  case FieldDescriptor::TYPE_##TYPE: {                                      \
    auto r = message_reflection->GetRepeatedField<CPPTYPE>(message, field); \
    target = stream->Write##TYPE_METHOD##Packed(                            \
        field->number(), r, FieldDataOnlyByteSize(field, message), target); \
    break;                                                                  \
  }

      HANDLE_PRIMITIVE_TYPE(INT32, int32, Int32, Int32)
      HANDLE_PRIMITIVE_TYPE(INT64, int64, Int64, Int64)
      HANDLE_PRIMITIVE_TYPE(SINT32, int32, SInt32, Int32)
      HANDLE_PRIMITIVE_TYPE(SINT64, int64, SInt64, Int64)
      HANDLE_PRIMITIVE_TYPE(UINT32, uint32, UInt32, UInt32)
      HANDLE_PRIMITIVE_TYPE(UINT64, uint64, UInt64, UInt64)
      HANDLE_PRIMITIVE_TYPE(ENUM, int, Enum, Enum)

#undef HANDLE_PRIMITIVE_TYPE
#define HANDLE_PRIMITIVE_TYPE(TYPE, CPPTYPE, TYPE_METHOD, CPPTYPE_METHOD)   \
  case FieldDescriptor::TYPE_##TYPE: {                                      \
    auto r = message_reflection->GetRepeatedField<CPPTYPE>(message, field); \
    target = stream->WriteFixedPacked(field->number(), r, target);          \
    break;                                                                  \
  }

      HANDLE_PRIMITIVE_TYPE(FIXED32, uint32, Fixed32, UInt32)
      HANDLE_PRIMITIVE_TYPE(FIXED64, uint64, Fixed64, UInt64)
      HANDLE_PRIMITIVE_TYPE(SFIXED32, int32, SFixed32, Int32)
      HANDLE_PRIMITIVE_TYPE(SFIXED64, int64, SFixed64, Int64)

      HANDLE_PRIMITIVE_TYPE(FLOAT, float, Float, Float)
      HANDLE_PRIMITIVE_TYPE(DOUBLE, double, Double, Double)

      HANDLE_PRIMITIVE_TYPE(BOOL, bool, Bool, Bool)
#undef HANDLE_PRIMITIVE_TYPE
      default:
        GOOGLE_LOG(FATAL) << "Invalid descriptor";
    }
    return target;
  }

  for (int j = 0; j < count; j++) {
    stream->EnsureSpace(&target);
    switch (field->type()) {
#define HANDLE_PRIMITIVE_TYPE(TYPE, CPPTYPE, TYPE_METHOD, CPPTYPE_METHOD)     \
  case FieldDescriptor::TYPE_##TYPE: {                                        \
    const CPPTYPE value =                                                     \
        field->is_repeated()                                                  \
            ? message_reflection->GetRepeated##CPPTYPE_METHOD(message, field, \
                                                              j)              \
            : message_reflection->Get##CPPTYPE_METHOD(message, field);        \
    target = WireFormatLite::Write##TYPE_METHOD##ToArray(field->number(),     \
                                                         value, target);      \
    break;                                                                    \
  }

      HANDLE_PRIMITIVE_TYPE(INT32, int32, Int32, Int32)
      HANDLE_PRIMITIVE_TYPE(INT64, int64, Int64, Int64)
      HANDLE_PRIMITIVE_TYPE(SINT32, int32, SInt32, Int32)
      HANDLE_PRIMITIVE_TYPE(SINT64, int64, SInt64, Int64)
      HANDLE_PRIMITIVE_TYPE(UINT32, uint32, UInt32, UInt32)
      HANDLE_PRIMITIVE_TYPE(UINT64, uint64, UInt64, UInt64)

      HANDLE_PRIMITIVE_TYPE(FIXED32, uint32, Fixed32, UInt32)
      HANDLE_PRIMITIVE_TYPE(FIXED64, uint64, Fixed64, UInt64)
      HANDLE_PRIMITIVE_TYPE(SFIXED32, int32, SFixed32, Int32)
      HANDLE_PRIMITIVE_TYPE(SFIXED64, int64, SFixed64, Int64)

      HANDLE_PRIMITIVE_TYPE(FLOAT, float, Float, Float)
      HANDLE_PRIMITIVE_TYPE(DOUBLE, double, Double, Double)

      HANDLE_PRIMITIVE_TYPE(BOOL, bool, Bool, Bool)
#undef HANDLE_PRIMITIVE_TYPE

#define HANDLE_TYPE(TYPE, TYPE_METHOD, CPPTYPE_METHOD)                         \
  case FieldDescriptor::TYPE_##TYPE:                                           \
    target = WireFormatLite::InternalWrite##TYPE_METHOD##ToArray(              \
        field->number(),                                                       \
        field->is_repeated()                                                   \
            ? (map_entries.empty()                                             \
                   ? message_reflection->GetRepeated##CPPTYPE_METHOD(message,  \
                                                                     field, j) \
                   : *map_entries[j])                                          \
            : message_reflection->Get##CPPTYPE_METHOD(message, field),         \
        target, stream);                                                       \
    break;

      HANDLE_TYPE(GROUP, Group, Message)
      HANDLE_TYPE(MESSAGE, Message, Message)
#undef HANDLE_TYPE

      case FieldDescriptor::TYPE_ENUM: {
        const EnumValueDescriptor* value =
            field->is_repeated()
                ? message_reflection->GetRepeatedEnum(message, field, j)
                : message_reflection->GetEnum(message, field);
        target = WireFormatLite::WriteEnumToArray(field->number(),
                                                  value->number(), target);
        break;
      }

      // Handle strings separately so that we can get string references
      // instead of copying.
      case FieldDescriptor::TYPE_STRING: {
        bool strict_utf8_check = StrictUtf8Check(field);
        std::string scratch;
        const std::string& value =
            field->is_repeated()
                ? message_reflection->GetRepeatedStringReference(message, field,
                                                                 j, &scratch)
                : message_reflection->GetStringReference(message, field,
                                                         &scratch);
        if (strict_utf8_check) {
          WireFormatLite::VerifyUtf8String(value.data(), value.length(),
                                           WireFormatLite::SERIALIZE,
                                           field->full_name().c_str());
        } else {
          VerifyUTF8StringNamedField(value.data(), value.length(), SERIALIZE,
                                     field->full_name().c_str());
        }
        target = stream->WriteString(field->number(), value, target);
        break;
      }

      case FieldDescriptor::TYPE_BYTES: {
        std::string scratch;
        const std::string& value =
            field->is_repeated()
                ? message_reflection->GetRepeatedStringReference(message, field,
                                                                 j, &scratch)
                : message_reflection->GetStringReference(message, field,
                                                         &scratch);
        target = stream->WriteString(field->number(), value, target);
        break;
      }
    }
  }
  return target;
}